

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx512::CurveNiMBIntersectorK<4,4>::
     intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx512::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  undefined4 uVar4;
  Geometry *pGVar5;
  __int_type_conflict _Var6;
  long lVar7;
  long lVar8;
  RTCFilterFunctionN p_Var9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined8 uVar23;
  ulong uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  int iVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  float fVar39;
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [12];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  int iVar54;
  int iVar55;
  int iVar56;
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  byte bVar60;
  byte bVar61;
  ulong uVar62;
  byte bVar63;
  byte bVar64;
  long lVar65;
  long lVar66;
  bool bVar67;
  ulong uVar68;
  uint uVar69;
  uint uVar141;
  uint uVar142;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  uint uVar144;
  uint uVar145;
  uint uVar146;
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  uint uVar143;
  uint uVar147;
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  float fVar148;
  float fVar165;
  float fVar166;
  vint4 bi_2;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined4 uVar171;
  vint4 bi_1;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar184 [16];
  undefined1 auVar188 [32];
  float fVar189;
  float fVar190;
  float fVar211;
  float fVar212;
  vint4 bi;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  float fVar213;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  float fVar222;
  float fVar223;
  float fVar224;
  undefined1 auVar221 [32];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  float fVar230;
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  vint4 ai;
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  float fVar238;
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [64];
  vint4 ai_1;
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [32];
  vint4 ai_2;
  undefined1 auVar242 [16];
  undefined1 auVar243 [32];
  undefined1 auVar244 [64];
  float fVar245;
  undefined1 auVar246 [32];
  float fVar248;
  float fVar249;
  float fVar250;
  undefined1 auVar247 [64];
  undefined1 auVar251 [16];
  undefined1 auVar252 [64];
  undefined1 auVar253 [64];
  float fVar254;
  undefined1 auVar255 [16];
  undefined1 auVar256 [28];
  float fVar258;
  undefined1 auVar257 [32];
  undefined1 auVar259 [16];
  undefined1 auVar260 [64];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [32];
  undefined1 auVar265 [64];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [64];
  undefined1 auVar271 [64];
  undefined1 auVar272 [64];
  undefined1 auVar273 [32];
  RTCFilterFunctionNArguments args;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  undefined1 local_890 [16];
  int local_874;
  uint local_870;
  uint local_86c;
  float local_868;
  float local_864;
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  RTCFilterFunctionNArguments local_810;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  ulong local_748;
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [16];
  undefined1 local_6f0 [16];
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [16];
  undefined1 local_650 [16];
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  undefined1 local_630 [16];
  undefined1 local_620 [16];
  Primitive *local_610;
  ulong local_608;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  undefined1 auStack_570 [16];
  undefined1 local_560 [32];
  undefined1 local_530 [16];
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  RTCHitN local_500 [16];
  undefined1 auStack_4f0 [16];
  undefined4 local_4e0;
  undefined4 uStack_4dc;
  undefined4 uStack_4d8;
  undefined4 uStack_4d4;
  float local_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [16];
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  undefined1 local_4a0 [16];
  uint local_490;
  uint uStack_48c;
  uint uStack_488;
  uint uStack_484;
  uint uStack_480;
  uint uStack_47c;
  uint uStack_478;
  uint uStack_474;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  uint auStack_160 [8];
  ulong uStack_140;
  int aiStack_138 [66];
  
  uVar68 = (ulong)(byte)prim[1];
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 4 + 6)));
  auVar80 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 5 + 6)));
  auVar76 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 6 + 6)));
  lVar65 = uVar68 * 0x25;
  auVar77 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0xf + 6)));
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)prim[1] * 0x10 + 6)));
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0x11 + 6)));
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0x1a + 6)));
  auVar82 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0x1b + 6)));
  auVar83 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0x1c + 6)));
  uVar171 = *(undefined4 *)(prim + lVar65 + 0x12);
  auVar267._4_4_ = uVar171;
  auVar267._0_4_ = uVar171;
  auVar267._8_4_ = uVar171;
  auVar267._12_4_ = uVar171;
  auVar84 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar84 = vinsertps_avx(auVar84,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar70 = vsubps_avx512vl(auVar84,*(undefined1 (*) [16])(prim + lVar65 + 6));
  fVar18 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar65 + 0x16)) *
           *(float *)(prim + lVar65 + 0x1a);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar68 * 7 + 6);
  auVar21 = vpmovsxwd_avx(auVar84);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar68 * 0xb + 6);
  auVar22 = vpmovsxwd_avx(auVar88);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + uVar68 * 9 + 6);
  auVar149 = vpmovsxwd_avx(auVar89);
  auVar71 = vpbroadcastd_avx512vl();
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar68 * 0xd + 6);
  auVar72 = vpmovsxwd_avx512vl(auVar85);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *(ulong *)(prim + uVar68 * 0x12 + 6);
  auVar2 = vpmovsxwd_avx(auVar2);
  auVar84 = vinsertps_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                              ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar84 = vinsertps_avx512f(auVar84,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar70 = vmulps_avx512vl(auVar267,auVar70);
  auVar73 = vmulps_avx512vl(auVar267,auVar84);
  auVar74 = vcvtdq2ps_avx512vl(auVar20);
  auVar75 = vcvtdq2ps_avx512vl(auVar80);
  auVar76 = vcvtdq2ps_avx512vl(auVar76);
  auVar77 = vcvtdq2ps_avx512vl(auVar77);
  auVar78 = vcvtdq2ps_avx512vl(auVar78);
  auVar84 = vcvtdq2ps_avx(auVar79);
  auVar88 = vcvtdq2ps_avx(auVar81);
  auVar89 = vcvtdq2ps_avx(auVar82);
  auVar85 = vcvtdq2ps_avx(auVar83);
  uVar171 = auVar73._0_4_;
  auVar251._4_4_ = uVar171;
  auVar251._0_4_ = uVar171;
  auVar251._8_4_ = uVar171;
  auVar251._12_4_ = uVar171;
  auVar20 = vshufps_avx(auVar73,auVar73,0x55);
  auVar80 = vshufps_avx(auVar73,auVar73,0xaa);
  auVar79 = vmulps_avx512vl(auVar80,auVar76);
  auVar172._0_4_ = auVar80._0_4_ * auVar84._0_4_;
  auVar172._4_4_ = auVar80._4_4_ * auVar84._4_4_;
  auVar172._8_4_ = auVar80._8_4_ * auVar84._8_4_;
  auVar172._12_4_ = auVar80._12_4_ * auVar84._12_4_;
  auVar73._0_4_ = auVar85._0_4_ * auVar80._0_4_;
  auVar73._4_4_ = auVar85._4_4_ * auVar80._4_4_;
  auVar73._8_4_ = auVar85._8_4_ * auVar80._8_4_;
  auVar73._12_4_ = auVar85._12_4_ * auVar80._12_4_;
  auVar80 = vfmadd231ps_avx512vl(auVar79,auVar20,auVar75);
  auVar79 = vfmadd231ps_avx512vl(auVar172,auVar20,auVar78);
  auVar20 = vfmadd231ps_fma(auVar73,auVar89,auVar20);
  auVar80 = vfmadd231ps_avx512vl(auVar80,auVar251,auVar74);
  auVar79 = vfmadd231ps_avx512vl(auVar79,auVar251,auVar77);
  auVar20 = vfmadd231ps_fma(auVar20,auVar88,auVar251);
  auVar81 = vbroadcastss_avx512vl(auVar70);
  auVar82 = vshufps_avx512vl(auVar70,auVar70,0x55);
  auVar83 = vshufps_avx512vl(auVar70,auVar70,0xaa);
  auVar76 = vmulps_avx512vl(auVar83,auVar76);
  auVar84 = vmulps_avx512vl(auVar83,auVar84);
  auVar85 = vmulps_avx512vl(auVar83,auVar85);
  auVar76 = vfmadd231ps_avx512vl(auVar76,auVar82,auVar75);
  auVar78 = vfmadd231ps_avx512vl(auVar84,auVar82,auVar78);
  auVar84 = vfmadd231ps_fma(auVar85,auVar82,auVar89);
  auVar73 = vfmadd231ps_avx512vl(auVar76,auVar81,auVar74);
  auVar74 = vfmadd231ps_avx512vl(auVar78,auVar81,auVar77);
  auVar70 = vfmadd231ps_fma(auVar84,auVar81,auVar88);
  auVar261._8_4_ = 0x7fffffff;
  auVar261._0_8_ = 0x7fffffff7fffffff;
  auVar261._12_4_ = 0x7fffffff;
  auVar84 = vandps_avx(auVar261,auVar80);
  auVar259._8_4_ = 0x219392ef;
  auVar259._0_8_ = 0x219392ef219392ef;
  auVar259._12_4_ = 0x219392ef;
  uVar62 = vcmpps_avx512vl(auVar84,auVar259,1);
  bVar67 = (bool)((byte)uVar62 & 1);
  auVar75._0_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar80._0_4_;
  bVar67 = (bool)((byte)(uVar62 >> 1) & 1);
  auVar75._4_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar80._4_4_;
  bVar67 = (bool)((byte)(uVar62 >> 2) & 1);
  auVar75._8_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar80._8_4_;
  bVar67 = (bool)((byte)(uVar62 >> 3) & 1);
  auVar75._12_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar80._12_4_;
  auVar84 = vandps_avx(auVar261,auVar79);
  uVar62 = vcmpps_avx512vl(auVar84,auVar259,1);
  bVar67 = (bool)((byte)uVar62 & 1);
  auVar86._0_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar79._0_4_;
  bVar67 = (bool)((byte)(uVar62 >> 1) & 1);
  auVar86._4_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar79._4_4_;
  bVar67 = (bool)((byte)(uVar62 >> 2) & 1);
  auVar86._8_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar79._8_4_;
  bVar67 = (bool)((byte)(uVar62 >> 3) & 1);
  auVar86._12_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar79._12_4_;
  auVar84 = vandps_avx(auVar261,auVar20);
  uVar62 = vcmpps_avx512vl(auVar84,auVar259,1);
  bVar67 = (bool)((byte)uVar62 & 1);
  auVar87._0_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar20._0_4_;
  bVar67 = (bool)((byte)(uVar62 >> 1) & 1);
  auVar87._4_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar20._4_4_;
  bVar67 = (bool)((byte)(uVar62 >> 2) & 1);
  auVar87._8_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar20._8_4_;
  bVar67 = (bool)((byte)(uVar62 >> 3) & 1);
  auVar87._12_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar20._12_4_;
  auVar255._8_4_ = 0x3f800000;
  auVar255._0_8_ = 0x3f8000003f800000;
  auVar255._12_4_ = 0x3f800000;
  auVar88 = vrcp14ps_avx512vl(auVar75);
  auVar84 = vfnmadd213ps_fma(auVar75,auVar88,auVar255);
  auVar89 = vfmadd132ps_fma(auVar84,auVar88,auVar88);
  auVar88 = vrcp14ps_avx512vl(auVar86);
  auVar84 = vfnmadd213ps_fma(auVar86,auVar88,auVar255);
  auVar85 = vfmadd132ps_fma(auVar84,auVar88,auVar88);
  auVar88 = vrcp14ps_avx512vl(auVar87);
  auVar84 = vfnmadd213ps_fma(auVar87,auVar88,auVar255);
  auVar82 = vfmadd132ps_fma(auVar84,auVar88,auVar88);
  auVar231._4_4_ = fVar18;
  auVar231._0_4_ = fVar18;
  auVar231._8_4_ = fVar18;
  auVar231._12_4_ = fVar18;
  auVar84 = vcvtdq2ps_avx(auVar21);
  auVar88 = vcvtdq2ps_avx(auVar22);
  auVar88 = vsubps_avx(auVar88,auVar84);
  auVar83 = vfmadd213ps_fma(auVar88,auVar231,auVar84);
  auVar84 = vcvtdq2ps_avx(auVar149);
  auVar88 = vcvtdq2ps_avx512vl(auVar72);
  auVar88 = vsubps_avx(auVar88,auVar84);
  auVar21 = vfmadd213ps_fma(auVar88,auVar231,auVar84);
  auVar84 = vcvtdq2ps_avx(auVar2);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar68 * 0x16 + 6);
  auVar88 = vpmovsxwd_avx(auVar20);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,auVar84);
  auVar2 = vfmadd213ps_fma(auVar88,auVar231,auVar84);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar68 * 0x14 + 6);
  auVar84 = vpmovsxwd_avx(auVar80);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar68 * 0x18 + 6);
  auVar88 = vpmovsxwd_avx(auVar76);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,auVar84);
  auVar20 = vfmadd213ps_fma(auVar88,auVar231,auVar84);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar68 * 0x1d + 6);
  auVar84 = vpmovsxwd_avx(auVar77);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar68 * 0x21 + 6);
  auVar88 = vpmovsxwd_avx(auVar78);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,auVar84);
  auVar80 = vfmadd213ps_fma(auVar88,auVar231,auVar84);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar68 * 0x1f + 6);
  auVar84 = vpmovsxwd_avx(auVar79);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar68 * 0x23 + 6);
  auVar88 = vpmovsxwd_avx(auVar81);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,auVar84);
  auVar88 = vfmadd213ps_fma(auVar88,auVar231,auVar84);
  auVar84 = vsubps_avx512vl(auVar83,auVar73);
  auVar232._0_4_ = auVar89._0_4_ * auVar84._0_4_;
  auVar232._4_4_ = auVar89._4_4_ * auVar84._4_4_;
  auVar232._8_4_ = auVar89._8_4_ * auVar84._8_4_;
  auVar232._12_4_ = auVar89._12_4_ * auVar84._12_4_;
  auVar84 = vsubps_avx512vl(auVar21,auVar73);
  auVar191._0_4_ = auVar89._0_4_ * auVar84._0_4_;
  auVar191._4_4_ = auVar89._4_4_ * auVar84._4_4_;
  auVar191._8_4_ = auVar89._8_4_ * auVar84._8_4_;
  auVar191._12_4_ = auVar89._12_4_ * auVar84._12_4_;
  auVar84 = vsubps_avx(auVar2,auVar74);
  auVar239._0_4_ = auVar85._0_4_ * auVar84._0_4_;
  auVar239._4_4_ = auVar85._4_4_ * auVar84._4_4_;
  auVar239._8_4_ = auVar85._8_4_ * auVar84._8_4_;
  auVar239._12_4_ = auVar85._12_4_ * auVar84._12_4_;
  auVar84 = vsubps_avx(auVar20,auVar74);
  auVar72._0_4_ = auVar85._0_4_ * auVar84._0_4_;
  auVar72._4_4_ = auVar85._4_4_ * auVar84._4_4_;
  auVar72._8_4_ = auVar85._8_4_ * auVar84._8_4_;
  auVar72._12_4_ = auVar85._12_4_ * auVar84._12_4_;
  auVar84 = vsubps_avx(auVar80,auVar70);
  auVar74._0_4_ = auVar82._0_4_ * auVar84._0_4_;
  auVar74._4_4_ = auVar82._4_4_ * auVar84._4_4_;
  auVar74._8_4_ = auVar82._8_4_ * auVar84._8_4_;
  auVar74._12_4_ = auVar82._12_4_ * auVar84._12_4_;
  auVar84 = vsubps_avx(auVar88,auVar70);
  auVar149._0_4_ = auVar82._0_4_ * auVar84._0_4_;
  auVar149._4_4_ = auVar82._4_4_ * auVar84._4_4_;
  auVar149._8_4_ = auVar82._8_4_ * auVar84._8_4_;
  auVar149._12_4_ = auVar82._12_4_ * auVar84._12_4_;
  auVar84 = vpminsd_avx(auVar232,auVar191);
  auVar88 = vpminsd_avx(auVar239,auVar72);
  auVar84 = vmaxps_avx(auVar84,auVar88);
  auVar88 = vpminsd_avx(auVar74,auVar149);
  uVar171 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar82._4_4_ = uVar171;
  auVar82._0_4_ = uVar171;
  auVar82._8_4_ = uVar171;
  auVar82._12_4_ = uVar171;
  auVar88 = vmaxps_avx512vl(auVar88,auVar82);
  auVar84 = vmaxps_avx(auVar84,auVar88);
  auVar83._8_4_ = 0x3f7ffffa;
  auVar83._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar83._12_4_ = 0x3f7ffffa;
  local_3a0 = vmulps_avx512vl(auVar84,auVar83);
  auVar84 = vpmaxsd_avx(auVar232,auVar191);
  auVar88 = vpmaxsd_avx(auVar239,auVar72);
  auVar84 = vminps_avx(auVar84,auVar88);
  auVar88 = vpmaxsd_avx(auVar74,auVar149);
  uVar171 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar21._4_4_ = uVar171;
  auVar21._0_4_ = uVar171;
  auVar21._8_4_ = uVar171;
  auVar21._12_4_ = uVar171;
  auVar88 = vminps_avx512vl(auVar88,auVar21);
  auVar84 = vminps_avx(auVar84,auVar88);
  auVar22._8_4_ = 0x3f800003;
  auVar22._0_8_ = 0x3f8000033f800003;
  auVar22._12_4_ = 0x3f800003;
  auVar84 = vmulps_avx512vl(auVar84,auVar22);
  uVar23 = vcmpps_avx512vl(local_3a0,auVar84,2);
  uVar26 = vpcmpgtd_avx512vl(auVar71,_DAT_01f4ad30);
  local_608 = (ulong)((byte)uVar23 & 0xf & (byte)uVar26);
  local_530 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_610 = prim;
LAB_018cf03a:
  auVar103._8_4_ = 0x7fffffff;
  auVar103._0_8_ = 0x7fffffff7fffffff;
  auVar103._12_4_ = 0x7fffffff;
  auVar103._16_4_ = 0x7fffffff;
  auVar103._20_4_ = 0x7fffffff;
  auVar103._24_4_ = 0x7fffffff;
  auVar103._28_4_ = 0x7fffffff;
  auVar252 = ZEXT3264(auVar103);
  if (local_608 == 0) {
    return;
  }
  lVar65 = 0;
  for (uVar62 = local_608; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x8000000000000000) {
    lVar65 = lVar65 + 1;
  }
  uVar3 = *(uint *)(local_610 + 2);
  local_748 = (ulong)*(uint *)(local_610 + lVar65 * 4 + 6);
  pGVar5 = (context->scene->geometries).items[uVar3].ptr;
  uVar62 = (ulong)*(uint *)(*(long *)&pGVar5->field_0x58 +
                           local_748 *
                           pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar18 = (pGVar5->time_range).lower;
  fVar18 = pGVar5->fnumTimeSegments *
           ((*(float *)(ray + k * 4 + 0x70) - fVar18) / ((pGVar5->time_range).upper - fVar18));
  auVar84 = vroundss_avx(ZEXT416((uint)fVar18),ZEXT416((uint)fVar18),9);
  auVar84 = vminss_avx(auVar84,ZEXT416((uint)(pGVar5->fnumTimeSegments + -1.0)));
  auVar84 = vmaxss_avx(ZEXT816(0) << 0x20,auVar84);
  fVar18 = fVar18 - auVar84._0_4_;
  _Var6 = pGVar5[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar66 = (long)(int)auVar84._0_4_ * 0x38;
  lVar65 = *(long *)(_Var6 + 0x10 + lVar66);
  lVar7 = *(long *)(_Var6 + 0x38 + lVar66);
  lVar8 = *(long *)(_Var6 + 0x48 + lVar66);
  pfVar1 = (float *)(lVar7 + uVar62 * lVar8);
  auVar192._0_4_ = fVar18 * *pfVar1;
  auVar192._4_4_ = fVar18 * pfVar1[1];
  auVar192._8_4_ = fVar18 * pfVar1[2];
  auVar192._12_4_ = fVar18 * pfVar1[3];
  pfVar1 = (float *)(lVar7 + (uVar62 + 1) * lVar8);
  auVar214._0_4_ = fVar18 * *pfVar1;
  auVar214._4_4_ = fVar18 * pfVar1[1];
  auVar214._8_4_ = fVar18 * pfVar1[2];
  auVar214._12_4_ = fVar18 * pfVar1[3];
  pfVar1 = (float *)(lVar7 + (uVar62 + 2) * lVar8);
  auVar225._0_4_ = fVar18 * *pfVar1;
  auVar225._4_4_ = fVar18 * pfVar1[1];
  auVar225._8_4_ = fVar18 * pfVar1[2];
  auVar225._12_4_ = fVar18 * pfVar1[3];
  pfVar1 = (float *)(lVar7 + lVar8 * (uVar62 + 3));
  auVar173._0_4_ = fVar18 * *pfVar1;
  auVar173._4_4_ = fVar18 * pfVar1[1];
  auVar173._8_4_ = fVar18 * pfVar1[2];
  auVar173._12_4_ = fVar18 * pfVar1[3];
  lVar7 = *(long *)(_Var6 + lVar66);
  fVar18 = 1.0 - fVar18;
  auVar71._4_4_ = fVar18;
  auVar71._0_4_ = fVar18;
  auVar71._8_4_ = fVar18;
  auVar71._12_4_ = fVar18;
  auVar89 = vfmadd231ps_fma(auVar192,auVar71,*(undefined1 (*) [16])(lVar7 + lVar65 * uVar62));
  auVar85 = vfmadd231ps_fma(auVar214,auVar71,*(undefined1 (*) [16])(lVar7 + lVar65 * (uVar62 + 1)));
  auVar2 = vfmadd231ps_fma(auVar225,auVar71,*(undefined1 (*) [16])(lVar7 + lVar65 * (uVar62 + 2)));
  auVar20 = vfmadd231ps_fma(auVar173,auVar71,*(undefined1 (*) [16])(lVar7 + lVar65 * (uVar62 + 3)));
  auVar84 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar88 = vinsertps_avx(auVar84,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  uVar171 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar266._4_4_ = uVar171;
  auVar266._0_4_ = uVar171;
  auVar266._8_4_ = uVar171;
  auVar266._12_4_ = uVar171;
  local_440._16_4_ = uVar171;
  local_440._0_16_ = auVar266;
  local_440._20_4_ = uVar171;
  local_440._24_4_ = uVar171;
  local_440._28_4_ = uVar171;
  uVar171 = *(undefined4 *)(ray + k * 4 + 0x50);
  auVar268._4_4_ = uVar171;
  auVar268._0_4_ = uVar171;
  auVar268._8_4_ = uVar171;
  auVar268._12_4_ = uVar171;
  local_360._16_4_ = uVar171;
  local_360._0_16_ = auVar268;
  local_360._20_4_ = uVar171;
  local_360._24_4_ = uVar171;
  local_360._28_4_ = uVar171;
  auVar84 = vunpcklps_avx(auVar266,auVar268);
  local_460 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x60)));
  auVar77 = local_460._0_16_;
  local_6f0 = vinsertps_avx512f(auVar84,auVar77,0x28);
  auVar233._0_4_ = auVar89._0_4_ + auVar85._0_4_ + auVar2._0_4_ + auVar20._0_4_;
  auVar233._4_4_ = auVar89._4_4_ + auVar85._4_4_ + auVar2._4_4_ + auVar20._4_4_;
  auVar233._8_4_ = auVar89._8_4_ + auVar85._8_4_ + auVar2._8_4_ + auVar20._8_4_;
  auVar233._12_4_ = auVar89._12_4_ + auVar85._12_4_ + auVar2._12_4_ + auVar20._12_4_;
  auVar70._8_4_ = 0x3e800000;
  auVar70._0_8_ = 0x3e8000003e800000;
  auVar70._12_4_ = 0x3e800000;
  auVar84 = vmulps_avx512vl(auVar233,auVar70);
  auVar84 = vsubps_avx(auVar84,auVar88);
  auVar84 = vdpps_avx(auVar84,local_6f0,0x7f);
  local_700 = vdpps_avx(local_6f0,local_6f0,0x7f);
  auVar260 = ZEXT1664(local_700);
  fVar18 = *(float *)(ray + k * 4 + 0x30);
  auVar265 = ZEXT464((uint)fVar18);
  auVar240._4_12_ = ZEXT812(0) << 0x20;
  auVar240._0_4_ = local_700._0_4_;
  auVar76 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar240);
  auVar80 = vfnmadd213ss_fma(auVar76,local_700,ZEXT416(0x40000000));
  local_2e0 = auVar84._0_4_ * auVar76._0_4_ * auVar80._0_4_;
  auVar237 = ZEXT3264(_DAT_01f7b040);
  auVar242._4_4_ = local_2e0;
  auVar242._0_4_ = local_2e0;
  auVar242._8_4_ = local_2e0;
  auVar242._12_4_ = local_2e0;
  fStack_3f0 = local_2e0;
  _local_400 = auVar242;
  fStack_3ec = local_2e0;
  fStack_3e8 = local_2e0;
  fStack_3e4 = local_2e0;
  auVar84 = vfmadd231ps_fma(auVar88,local_6f0,auVar242);
  auVar84 = vblendps_avx(auVar84,ZEXT816(0) << 0x40,8);
  auVar88 = vsubps_avx(auVar89,auVar84);
  auVar244 = ZEXT1664(auVar88);
  auVar89 = vsubps_avx(auVar2,auVar84);
  auVar85 = vsubps_avx(auVar85,auVar84);
  auVar84 = vsubps_avx(auVar20,auVar84);
  auVar247 = ZEXT1664(auVar84);
  auVar90 = vbroadcastss_avx512vl(auVar88);
  auVar100._8_4_ = 1;
  auVar100._0_8_ = 0x100000001;
  auVar100._12_4_ = 1;
  auVar100._16_4_ = 1;
  auVar100._20_4_ = 1;
  auVar100._24_4_ = 1;
  auVar100._28_4_ = 1;
  local_680 = ZEXT1632(auVar88);
  auVar91 = vpermps_avx512vl(auVar100,local_680);
  auVar270 = ZEXT3264(auVar91);
  auVar101._8_4_ = 2;
  auVar101._0_8_ = 0x200000002;
  auVar101._12_4_ = 2;
  auVar101._16_4_ = 2;
  auVar101._20_4_ = 2;
  auVar101._24_4_ = 2;
  auVar101._28_4_ = 2;
  auVar92 = vpermps_avx512vl(auVar101,local_680);
  auVar104._8_4_ = 3;
  auVar104._0_8_ = 0x300000003;
  auVar104._12_4_ = 3;
  auVar104._16_4_ = 3;
  auVar104._20_4_ = 3;
  auVar104._24_4_ = 3;
  auVar104._28_4_ = 3;
  auVar93 = vpermps_avx512vl(auVar104,local_680);
  auVar94 = vbroadcastss_avx512vl(auVar85);
  local_6c0 = ZEXT1632(auVar85);
  auVar95 = vpermps_avx512vl(auVar100,local_6c0);
  auVar96 = vpermps_avx512vl(auVar101,local_6c0);
  auVar97 = vpermps_avx512vl(auVar104,local_6c0);
  auVar98 = vbroadcastss_avx512vl(auVar89);
  local_6a0 = ZEXT1632(auVar89);
  local_840 = vpermps_avx512vl(auVar100,local_6a0);
  auVar271 = ZEXT3264(local_840);
  local_860 = vpermps_avx512vl(auVar101,local_6a0);
  auVar272 = ZEXT3264(local_860);
  auVar99 = vpermps_avx512vl(auVar104,local_6a0);
  local_260 = vbroadcastss_avx512vl(auVar84);
  _local_6e0 = ZEXT1632(auVar84);
  local_280 = vpermps_avx512vl(auVar100,_local_6e0);
  local_2a0 = vpermps_avx2(auVar101,_local_6e0);
  local_2c0 = vpermps_avx2(auVar104,_local_6e0);
  auVar84 = vmulss_avx512f(auVar77,auVar77);
  auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),local_360,local_360);
  auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),local_440,local_440);
  local_220._0_4_ = auVar84._0_4_;
  local_220._4_4_ = local_220._0_4_;
  local_220._8_4_ = local_220._0_4_;
  local_220._12_4_ = local_220._0_4_;
  local_220._16_4_ = local_220._0_4_;
  local_220._20_4_ = local_220._0_4_;
  local_220._24_4_ = local_220._0_4_;
  local_220._28_4_ = local_220._0_4_;
  local_240 = vandps_avx(auVar103,local_220);
  local_660 = ZEXT416((uint)local_2e0);
  local_2e0 = fVar18 - local_2e0;
  fStack_2dc = local_2e0;
  fStack_2d8 = local_2e0;
  fStack_2d4 = local_2e0;
  fStack_2d0 = local_2e0;
  fStack_2cc = local_2e0;
  fStack_2c8 = local_2e0;
  fStack_2c4 = local_2e0;
  local_510 = vpbroadcastd_avx512vl();
  uVar62 = 0;
  local_874 = 1;
  local_520 = vpbroadcastd_avx512vl();
  auVar84 = vsqrtss_avx(local_700,local_700);
  local_864 = auVar84._0_4_;
  auVar84 = vsqrtss_avx(local_700,local_700);
  local_868 = auVar84._0_4_;
  local_390 = ZEXT816(0x3f80000000000000);
  do {
    auVar84 = vmovshdup_avx(local_390);
    auVar84 = vsubps_avx(auVar84,local_390);
    auVar150._0_4_ = auVar84._0_4_;
    fVar19 = auVar150._0_4_ * 0.04761905;
    uVar171 = local_390._0_4_;
    local_780._4_4_ = uVar171;
    local_780._0_4_ = uVar171;
    local_780._8_4_ = uVar171;
    local_780._12_4_ = uVar171;
    local_780._16_4_ = uVar171;
    local_780._20_4_ = uVar171;
    local_780._24_4_ = uVar171;
    local_780._28_4_ = uVar171;
    auVar150._4_4_ = auVar150._0_4_;
    auVar150._8_4_ = auVar150._0_4_;
    auVar150._12_4_ = auVar150._0_4_;
    local_720._16_4_ = auVar150._0_4_;
    local_720._0_16_ = auVar150;
    local_720._20_4_ = auVar150._0_4_;
    local_720._24_4_ = auVar150._0_4_;
    local_720._28_4_ = auVar150._0_4_;
    auVar84 = vfmadd231ps_fma(local_780,local_720,auVar237._0_32_);
    auVar100 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar101 = vsubps_avx512vl(auVar100,ZEXT1632(auVar84));
    fVar245 = auVar101._0_4_;
    fVar249 = auVar101._4_4_;
    fVar222 = auVar101._8_4_;
    fVar224 = auVar101._12_4_;
    fVar254 = auVar101._16_4_;
    fVar190 = auVar101._20_4_;
    fVar17 = auVar101._24_4_;
    fVar148 = fVar245 * fVar245 * fVar245;
    fVar165 = fVar249 * fVar249 * fVar249;
    auVar105._4_4_ = fVar165;
    auVar105._0_4_ = fVar148;
    fVar166 = fVar222 * fVar222 * fVar222;
    auVar105._8_4_ = fVar166;
    fVar167 = fVar224 * fVar224 * fVar224;
    auVar105._12_4_ = fVar167;
    fVar168 = fVar254 * fVar254 * fVar254;
    auVar105._16_4_ = fVar168;
    fVar169 = fVar190 * fVar190 * fVar190;
    auVar105._20_4_ = fVar169;
    fVar170 = fVar17 * fVar17 * fVar17;
    auVar105._24_4_ = fVar170;
    auVar105._28_4_ = auVar150._0_4_;
    auVar102 = vbroadcastss_avx512vl(ZEXT416(0x40800000));
    auVar103 = vmulps_avx512vl(auVar105,auVar102);
    fVar248 = auVar84._0_4_;
    fVar250 = auVar84._4_4_;
    fVar223 = auVar84._8_4_;
    fVar230 = auVar84._12_4_;
    fVar189 = fVar248 * fVar248 * fVar248;
    fVar211 = fVar250 * fVar250 * fVar250;
    fVar212 = fVar223 * fVar223 * fVar223;
    fVar213 = fVar230 * fVar230 * fVar230;
    auVar253._0_4_ = fVar248 * fVar245;
    auVar253._4_4_ = fVar250 * fVar249;
    auVar253._8_4_ = fVar223 * fVar222;
    auVar253._12_4_ = fVar230 * fVar224;
    auVar253._16_4_ = fVar254 * 0.0;
    auVar253._20_4_ = fVar190 * 0.0;
    auVar253._28_36_ = auVar252._28_36_;
    auVar253._24_4_ = fVar17 * 0.0;
    auVar104 = vmulps_avx512vl(ZEXT1632(CONCAT412(fVar213,CONCAT48(fVar212,CONCAT44(fVar211,fVar189)
                                                                  ))),auVar102);
    fVar258 = auVar104._28_4_ + auVar150._0_4_;
    fVar39 = auVar260._28_4_;
    fVar238 = fVar258 + fVar39 + auVar237._28_4_;
    auVar110._4_4_ = fVar165 * 0.16666667;
    auVar110._0_4_ = fVar148 * 0.16666667;
    auVar110._8_4_ = fVar166 * 0.16666667;
    auVar110._12_4_ = fVar167 * 0.16666667;
    auVar110._16_4_ = fVar168 * 0.16666667;
    auVar110._20_4_ = fVar169 * 0.16666667;
    auVar110._24_4_ = fVar170 * 0.16666667;
    auVar110._28_4_ = fVar258;
    auVar107._4_4_ =
         (auVar253._4_4_ * fVar249 * 12.0 + auVar253._4_4_ * fVar250 * 6.0 +
         fVar211 + auVar103._4_4_) * 0.16666667;
    auVar107._0_4_ =
         (auVar253._0_4_ * fVar245 * 12.0 + auVar253._0_4_ * fVar248 * 6.0 +
         fVar189 + auVar103._0_4_) * 0.16666667;
    auVar107._8_4_ =
         (auVar253._8_4_ * fVar222 * 12.0 + auVar253._8_4_ * fVar223 * 6.0 +
         fVar212 + auVar103._8_4_) * 0.16666667;
    auVar107._12_4_ =
         (auVar253._12_4_ * fVar224 * 12.0 + auVar253._12_4_ * fVar230 * 6.0 +
         fVar213 + auVar103._12_4_) * 0.16666667;
    auVar107._16_4_ =
         (auVar253._16_4_ * fVar254 * 12.0 + auVar253._16_4_ * 0.0 * 6.0 + auVar103._16_4_ + 0.0) *
         0.16666667;
    auVar107._20_4_ =
         (auVar253._20_4_ * fVar190 * 12.0 + auVar253._20_4_ * 0.0 * 6.0 + auVar103._20_4_ + 0.0) *
         0.16666667;
    auVar107._24_4_ =
         (auVar253._24_4_ * fVar17 * 12.0 + auVar253._24_4_ * 0.0 * 6.0 + auVar103._24_4_ + 0.0) *
         0.16666667;
    auVar107._28_4_ = fVar39;
    auVar108._4_4_ =
         (auVar104._4_4_ + fVar165 +
         auVar253._4_4_ * fVar250 * 12.0 + auVar253._4_4_ * fVar249 * 6.0) * 0.16666667;
    auVar108._0_4_ =
         (auVar104._0_4_ + fVar148 +
         auVar253._0_4_ * fVar248 * 12.0 + auVar253._0_4_ * fVar245 * 6.0) * 0.16666667;
    auVar108._8_4_ =
         (auVar104._8_4_ + fVar166 +
         auVar253._8_4_ * fVar223 * 12.0 + auVar253._8_4_ * fVar222 * 6.0) * 0.16666667;
    auVar108._12_4_ =
         (auVar104._12_4_ + fVar167 +
         auVar253._12_4_ * fVar230 * 12.0 + auVar253._12_4_ * fVar224 * 6.0) * 0.16666667;
    auVar108._16_4_ =
         (auVar104._16_4_ + fVar168 + auVar253._16_4_ * 0.0 * 12.0 + auVar253._16_4_ * fVar254 * 6.0
         ) * 0.16666667;
    auVar108._20_4_ =
         (auVar104._20_4_ + fVar169 + auVar253._20_4_ * 0.0 * 12.0 + auVar253._20_4_ * fVar190 * 6.0
         ) * 0.16666667;
    auVar108._24_4_ =
         (auVar104._24_4_ + fVar170 + auVar253._24_4_ * 0.0 * 12.0 + auVar253._24_4_ * fVar17 * 6.0)
         * 0.16666667;
    auVar108._28_4_ = auVar265._28_4_;
    fVar189 = fVar189 * 0.16666667;
    fVar211 = fVar211 * 0.16666667;
    fVar212 = fVar212 * 0.16666667;
    fVar213 = fVar213 * 0.16666667;
    auVar109._28_4_ = fVar238;
    auVar109._0_28_ = ZEXT1628(CONCAT412(fVar213,CONCAT48(fVar212,CONCAT44(fVar211,fVar189))));
    auVar103 = vmulps_avx512vl(local_260,auVar109);
    auVar104 = vmulps_avx512vl(local_280,auVar109);
    auVar111._4_4_ = local_2a0._4_4_ * fVar211;
    auVar111._0_4_ = local_2a0._0_4_ * fVar189;
    auVar111._8_4_ = local_2a0._8_4_ * fVar212;
    auVar111._12_4_ = local_2a0._12_4_ * fVar213;
    auVar111._16_4_ = local_2a0._16_4_ * 0.0;
    auVar111._20_4_ = local_2a0._20_4_ * 0.0;
    auVar111._24_4_ = local_2a0._24_4_ * 0.0;
    auVar111._28_4_ = auVar150._0_4_;
    auVar112._4_4_ = local_2c0._4_4_ * fVar211;
    auVar112._0_4_ = local_2c0._0_4_ * fVar189;
    auVar112._8_4_ = local_2c0._8_4_ * fVar212;
    auVar112._12_4_ = local_2c0._12_4_ * fVar213;
    auVar112._16_4_ = local_2c0._16_4_ * 0.0;
    auVar112._20_4_ = local_2c0._20_4_ * 0.0;
    auVar112._24_4_ = local_2c0._24_4_ * 0.0;
    auVar112._28_4_ = fVar238;
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar108,auVar98);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar108,auVar271._0_32_);
    auVar105 = vfmadd231ps_avx512vl(auVar111,auVar108,auVar272._0_32_);
    auVar106 = vfmadd231ps_avx512vl(auVar112,auVar99,auVar108);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar107,auVar94);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar107,auVar95);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar107,auVar96);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar97,auVar107);
    auVar107 = vfmadd231ps_avx512vl(auVar103,auVar110,auVar90);
    auVar108 = vfmadd231ps_avx512vl(auVar104,auVar110,auVar270._0_32_);
    auVar109 = vfmadd231ps_avx512vl(auVar105,auVar110,auVar92);
    auVar104 = vfmadd231ps_avx512vl(auVar106,auVar93,auVar110);
    auVar110 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar105 = vxorps_avx512vl(auVar101,auVar110);
    auVar103 = vxorps_avx512vl(ZEXT1632(auVar84),auVar110);
    auVar125._0_4_ = auVar103._0_4_ * fVar248;
    auVar125._4_4_ = auVar103._4_4_ * fVar250;
    auVar125._8_4_ = auVar103._8_4_ * fVar223;
    auVar125._12_4_ = auVar103._12_4_ * fVar230;
    auVar125._16_4_ = auVar103._16_4_ * 0.0;
    auVar125._20_4_ = auVar103._20_4_ * 0.0;
    auVar125._24_4_ = auVar103._24_4_ * 0.0;
    auVar125._28_4_ = 0;
    auVar106 = vmulps_avx512vl(auVar253._0_32_,auVar102);
    auVar103 = vsubps_avx(auVar125,auVar106);
    auVar113._4_4_ = auVar105._4_4_ * fVar249 * 0.5;
    auVar113._0_4_ = auVar105._0_4_ * fVar245 * 0.5;
    auVar113._8_4_ = auVar105._8_4_ * fVar222 * 0.5;
    auVar113._12_4_ = auVar105._12_4_ * fVar224 * 0.5;
    auVar113._16_4_ = auVar105._16_4_ * fVar254 * 0.5;
    auVar113._20_4_ = auVar105._20_4_ * fVar190 * 0.5;
    auVar113._24_4_ = auVar105._24_4_ * fVar17 * 0.5;
    auVar113._28_4_ = auVar101._28_4_;
    auVar115._4_4_ = auVar103._4_4_ * 0.5;
    auVar115._0_4_ = auVar103._0_4_ * 0.5;
    auVar115._8_4_ = auVar103._8_4_ * 0.5;
    auVar115._12_4_ = auVar103._12_4_ * 0.5;
    auVar115._16_4_ = auVar103._16_4_ * 0.5;
    auVar115._20_4_ = auVar103._20_4_ * 0.5;
    auVar115._24_4_ = auVar103._24_4_ * 0.5;
    auVar115._28_4_ = auVar103._28_4_;
    auVar116._4_4_ = (auVar106._4_4_ + fVar249 * fVar249) * 0.5;
    auVar116._0_4_ = (auVar106._0_4_ + fVar245 * fVar245) * 0.5;
    auVar116._8_4_ = (auVar106._8_4_ + fVar222 * fVar222) * 0.5;
    auVar116._12_4_ = (auVar106._12_4_ + fVar224 * fVar224) * 0.5;
    auVar116._16_4_ = (auVar106._16_4_ + fVar254 * fVar254) * 0.5;
    auVar116._20_4_ = (auVar106._20_4_ + fVar190 * fVar190) * 0.5;
    auVar116._24_4_ = (auVar106._24_4_ + fVar17 * fVar17) * 0.5;
    auVar116._28_4_ = auVar106._28_4_ + auVar244._28_4_;
    fVar245 = fVar248 * fVar248 * 0.5;
    fVar248 = fVar250 * fVar250 * 0.5;
    fVar249 = fVar223 * fVar223 * 0.5;
    fVar250 = fVar230 * fVar230 * 0.5;
    auVar117._28_4_ = auVar247._28_4_;
    auVar117._0_28_ = ZEXT1628(CONCAT412(fVar250,CONCAT48(fVar249,CONCAT44(fVar248,fVar245))));
    auVar103 = vmulps_avx512vl(local_260,auVar117);
    auVar101 = vmulps_avx512vl(local_280,auVar117);
    auVar121._4_4_ = local_2a0._4_4_ * fVar248;
    auVar121._0_4_ = local_2a0._0_4_ * fVar245;
    auVar121._8_4_ = local_2a0._8_4_ * fVar249;
    auVar121._12_4_ = local_2a0._12_4_ * fVar250;
    auVar121._16_4_ = local_2a0._16_4_ * 0.0;
    auVar121._20_4_ = local_2a0._20_4_ * 0.0;
    auVar121._24_4_ = local_2a0._24_4_ * 0.0;
    auVar121._28_4_ = fVar39;
    auVar122._4_4_ = fVar248 * local_2c0._4_4_;
    auVar122._0_4_ = fVar245 * local_2c0._0_4_;
    auVar122._8_4_ = fVar249 * local_2c0._8_4_;
    auVar122._12_4_ = fVar250 * local_2c0._12_4_;
    auVar122._16_4_ = local_2c0._16_4_ * 0.0;
    auVar122._20_4_ = local_2c0._20_4_ * 0.0;
    auVar122._24_4_ = local_2c0._24_4_ * 0.0;
    auVar122._28_4_ = auVar247._28_4_;
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar116,auVar98);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar116,auVar271._0_32_);
    auVar105 = vfmadd231ps_avx512vl(auVar121,auVar116,auVar272._0_32_);
    auVar84 = vfmadd231ps_fma(auVar122,auVar99,auVar116);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar115,auVar94);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar115,auVar95);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar115,auVar96);
    auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar84),auVar97,auVar115);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar113,auVar90);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar113,auVar270._0_32_);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar113,auVar92);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar93,auVar113);
    auVar129._4_4_ = auVar103._4_4_ * fVar19;
    auVar129._0_4_ = auVar103._0_4_ * fVar19;
    auVar129._8_4_ = auVar103._8_4_ * fVar19;
    auVar129._12_4_ = auVar103._12_4_ * fVar19;
    auVar129._16_4_ = auVar103._16_4_ * fVar19;
    auVar129._20_4_ = auVar103._20_4_ * fVar19;
    auVar129._24_4_ = auVar103._24_4_ * fVar19;
    auVar129._28_4_ = auVar99._28_4_;
    auVar265 = ZEXT3264(auVar129);
    auVar130._4_4_ = auVar101._4_4_ * fVar19;
    auVar130._0_4_ = auVar101._0_4_ * fVar19;
    auVar130._8_4_ = auVar101._8_4_ * fVar19;
    auVar130._12_4_ = auVar101._12_4_ * fVar19;
    auVar130._16_4_ = auVar101._16_4_ * fVar19;
    auVar130._20_4_ = auVar101._20_4_ * fVar19;
    auVar130._24_4_ = auVar101._24_4_ * fVar19;
    auVar130._28_4_ = 0x3e2aaaab;
    auVar131._4_4_ = auVar105._4_4_ * fVar19;
    auVar131._0_4_ = auVar105._0_4_ * fVar19;
    auVar131._8_4_ = auVar105._8_4_ * fVar19;
    auVar131._12_4_ = auVar105._12_4_ * fVar19;
    auVar131._16_4_ = auVar105._16_4_ * fVar19;
    auVar131._20_4_ = auVar105._20_4_ * fVar19;
    auVar131._24_4_ = auVar105._24_4_ * fVar19;
    auVar131._28_4_ = 0x40c00000;
    fVar245 = auVar106._0_4_ * fVar19;
    fVar248 = auVar106._4_4_ * fVar19;
    auVar123._4_4_ = fVar248;
    auVar123._0_4_ = fVar245;
    fVar249 = auVar106._8_4_ * fVar19;
    auVar123._8_4_ = fVar249;
    fVar250 = auVar106._12_4_ * fVar19;
    auVar123._12_4_ = fVar250;
    fVar222 = auVar106._16_4_ * fVar19;
    auVar123._16_4_ = fVar222;
    fVar223 = auVar106._20_4_ * fVar19;
    auVar123._20_4_ = fVar223;
    fVar224 = auVar106._24_4_ * fVar19;
    auVar123._24_4_ = fVar224;
    auVar123._28_4_ = fVar19;
    auVar84 = vxorps_avx512vl(auVar100._0_16_,auVar100._0_16_);
    auVar111 = vpermt2ps_avx512vl(auVar107,_DAT_01fb9fc0,ZEXT1632(auVar84));
    auVar252 = ZEXT3264(auVar111);
    auVar112 = vpermt2ps_avx512vl(auVar108,_DAT_01fb9fc0,ZEXT1632(auVar84));
    auVar101 = ZEXT1632(auVar84);
    auVar113 = vpermt2ps_avx512vl(auVar109,_DAT_01fb9fc0,auVar101);
    auVar260 = ZEXT3264(auVar113);
    auVar126._0_4_ = fVar245 + auVar104._0_4_;
    auVar126._4_4_ = fVar248 + auVar104._4_4_;
    auVar126._8_4_ = fVar249 + auVar104._8_4_;
    auVar126._12_4_ = fVar250 + auVar104._12_4_;
    auVar126._16_4_ = fVar222 + auVar104._16_4_;
    auVar126._20_4_ = fVar223 + auVar104._20_4_;
    auVar126._24_4_ = fVar224 + auVar104._24_4_;
    auVar126._28_4_ = fVar19 + auVar104._28_4_;
    auVar103 = vmaxps_avx(auVar104,auVar126);
    auVar100 = vminps_avx(auVar104,auVar126);
    auVar114 = vpermt2ps_avx512vl(auVar104,_DAT_01fb9fc0,auVar101);
    auVar115 = vpermt2ps_avx512vl(auVar129,_DAT_01fb9fc0,auVar101);
    auVar116 = vpermt2ps_avx512vl(auVar130,_DAT_01fb9fc0,auVar101);
    auVar273 = ZEXT1632(auVar84);
    auVar117 = vpermt2ps_avx512vl(auVar131,_DAT_01fb9fc0,auVar273);
    auVar101 = vpermt2ps_avx512vl(auVar123,_DAT_01fb9fc0,auVar273);
    auVar118 = vsubps_avx512vl(auVar114,auVar101);
    auVar101 = vsubps_avx(auVar111,auVar107);
    auVar247 = ZEXT3264(auVar101);
    auVar104 = vsubps_avx(auVar112,auVar108);
    auVar244 = ZEXT3264(auVar104);
    auVar105 = vsubps_avx(auVar113,auVar109);
    auVar106 = vmulps_avx512vl(auVar104,auVar131);
    auVar106 = vfmsub231ps_avx512vl(auVar106,auVar130,auVar105);
    auVar119 = vmulps_avx512vl(auVar105,auVar129);
    auVar119 = vfmsub231ps_avx512vl(auVar119,auVar131,auVar101);
    auVar120 = vmulps_avx512vl(auVar101,auVar130);
    auVar120 = vfmsub231ps_avx512vl(auVar120,auVar129,auVar104);
    auVar120 = vmulps_avx512vl(auVar120,auVar120);
    auVar119 = vfmadd231ps_avx512vl(auVar120,auVar119,auVar119);
    auVar119 = vfmadd231ps_avx512vl(auVar119,auVar106,auVar106);
    auVar106 = vmulps_avx512vl(auVar105,auVar105);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar104,auVar104);
    auVar120 = vfmadd231ps_avx512vl(auVar106,auVar101,auVar101);
    auVar121 = vrcp14ps_avx512vl(auVar120);
    auVar106._8_4_ = 0x3f800000;
    auVar106._0_8_ = 0x3f8000003f800000;
    auVar106._12_4_ = 0x3f800000;
    auVar106._16_4_ = 0x3f800000;
    auVar106._20_4_ = 0x3f800000;
    auVar106._24_4_ = 0x3f800000;
    auVar106._28_4_ = 0x3f800000;
    auVar106 = vfnmadd213ps_avx512vl(auVar121,auVar120,auVar106);
    auVar106 = vfmadd132ps_avx512vl(auVar106,auVar121,auVar121);
    auVar119 = vmulps_avx512vl(auVar119,auVar106);
    auVar121 = vmulps_avx512vl(auVar104,auVar117);
    auVar121 = vfmsub231ps_avx512vl(auVar121,auVar116,auVar105);
    auVar122 = vmulps_avx512vl(auVar105,auVar115);
    auVar122 = vfmsub231ps_avx512vl(auVar122,auVar117,auVar101);
    auVar123 = vmulps_avx512vl(auVar101,auVar116);
    auVar123 = vfmsub231ps_avx512vl(auVar123,auVar115,auVar104);
    auVar123 = vmulps_avx512vl(auVar123,auVar123);
    auVar122 = vfmadd231ps_avx512vl(auVar123,auVar122,auVar122);
    auVar121 = vfmadd231ps_avx512vl(auVar122,auVar121,auVar121);
    auVar106 = vmulps_avx512vl(auVar121,auVar106);
    auVar106 = vmaxps_avx512vl(auVar119,auVar106);
    auVar106 = vsqrtps_avx512vl(auVar106);
    auVar119 = vmaxps_avx512vl(auVar118,auVar114);
    auVar103 = vmaxps_avx512vl(auVar103,auVar119);
    auVar121 = vaddps_avx512vl(auVar106,auVar103);
    auVar103 = vminps_avx512vl(auVar118,auVar114);
    auVar103 = vminps_avx(auVar100,auVar103);
    auVar103 = vsubps_avx512vl(auVar103,auVar106);
    auVar114._8_4_ = 0x3f800002;
    auVar114._0_8_ = 0x3f8000023f800002;
    auVar114._12_4_ = 0x3f800002;
    auVar114._16_4_ = 0x3f800002;
    auVar114._20_4_ = 0x3f800002;
    auVar114._24_4_ = 0x3f800002;
    auVar114._28_4_ = 0x3f800002;
    auVar100 = vmulps_avx512vl(auVar121,auVar114);
    auVar118._8_4_ = 0x3f7ffffc;
    auVar118._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar118._12_4_ = 0x3f7ffffc;
    auVar118._16_4_ = 0x3f7ffffc;
    auVar118._20_4_ = 0x3f7ffffc;
    auVar118._24_4_ = 0x3f7ffffc;
    auVar118._28_4_ = 0x3f7ffffc;
    auVar103 = vmulps_avx512vl(auVar103,auVar118);
    auVar100 = vmulps_avx512vl(auVar100,auVar100);
    auVar106 = vrsqrt14ps_avx512vl(auVar120);
    auVar119._8_4_ = 0xbf000000;
    auVar119._0_8_ = 0xbf000000bf000000;
    auVar119._12_4_ = 0xbf000000;
    auVar119._16_4_ = 0xbf000000;
    auVar119._20_4_ = 0xbf000000;
    auVar119._24_4_ = 0xbf000000;
    auVar119._28_4_ = 0xbf000000;
    auVar114 = vmulps_avx512vl(auVar120,auVar119);
    fVar245 = auVar106._0_4_;
    fVar248 = auVar106._4_4_;
    fVar249 = auVar106._8_4_;
    fVar250 = auVar106._12_4_;
    fVar222 = auVar106._16_4_;
    fVar223 = auVar106._20_4_;
    fVar224 = auVar106._24_4_;
    auVar124._4_4_ = fVar248 * fVar248 * fVar248 * auVar114._4_4_;
    auVar124._0_4_ = fVar245 * fVar245 * fVar245 * auVar114._0_4_;
    auVar124._8_4_ = fVar249 * fVar249 * fVar249 * auVar114._8_4_;
    auVar124._12_4_ = fVar250 * fVar250 * fVar250 * auVar114._12_4_;
    auVar124._16_4_ = fVar222 * fVar222 * fVar222 * auVar114._16_4_;
    auVar124._20_4_ = fVar223 * fVar223 * fVar223 * auVar114._20_4_;
    auVar124._24_4_ = fVar224 * fVar224 * fVar224 * auVar114._24_4_;
    auVar124._28_4_ = auVar121._28_4_;
    auVar120._8_4_ = 0x3fc00000;
    auVar120._0_8_ = 0x3fc000003fc00000;
    auVar120._12_4_ = 0x3fc00000;
    auVar120._16_4_ = 0x3fc00000;
    auVar120._20_4_ = 0x3fc00000;
    auVar120._24_4_ = 0x3fc00000;
    auVar120._28_4_ = 0x3fc00000;
    auVar106 = vfmadd231ps_avx512vl(auVar124,auVar106,auVar120);
    auVar114 = vmulps_avx512vl(auVar101,auVar106);
    auVar118 = vmulps_avx512vl(auVar104,auVar106);
    auVar119 = vmulps_avx512vl(auVar105,auVar106);
    auVar120 = vsubps_avx512vl(auVar273,auVar107);
    auVar121 = vsubps_avx512vl(auVar273,auVar108);
    auVar122 = vsubps_avx512vl(auVar273,auVar109);
    auVar123 = vmulps_avx512vl(local_460,auVar122);
    auVar123 = vfmadd231ps_avx512vl(auVar123,local_360,auVar121);
    auVar123 = vfmadd231ps_avx512vl(auVar123,local_440,auVar120);
    auVar124 = vmulps_avx512vl(auVar122,auVar122);
    auVar124 = vfmadd231ps_avx512vl(auVar124,auVar121,auVar121);
    auVar124 = vfmadd231ps_avx512vl(auVar124,auVar120,auVar120);
    auVar125 = vmulps_avx512vl(local_460,auVar119);
    auVar125 = vfmadd231ps_avx512vl(auVar125,auVar118,local_360);
    auVar125 = vfmadd231ps_avx512vl(auVar125,auVar114,local_440);
    auVar119 = vmulps_avx512vl(auVar122,auVar119);
    auVar118 = vfmadd231ps_avx512vl(auVar119,auVar121,auVar118);
    auVar114 = vfmadd231ps_avx512vl(auVar118,auVar120,auVar114);
    auVar118 = vmulps_avx512vl(auVar125,auVar125);
    auVar119 = vsubps_avx512vl(local_220,auVar118);
    auVar126 = vmulps_avx512vl(auVar125,auVar114);
    auVar123 = vsubps_avx512vl(auVar123,auVar126);
    auVar123 = vaddps_avx512vl(auVar123,auVar123);
    auVar126 = vmulps_avx512vl(auVar114,auVar114);
    local_740 = vsubps_avx512vl(auVar124,auVar126);
    auVar100 = vsubps_avx512vl(local_740,auVar100);
    local_7a0 = vmulps_avx512vl(auVar123,auVar123);
    _local_7c0 = vmulps_avx512vl(auVar119,auVar102);
    auVar124 = vmulps_avx512vl(_local_7c0,auVar100);
    auVar124 = vsubps_avx512vl(local_7a0,auVar124);
    auVar84 = vxorps_avx512vl(auVar102._0_16_,auVar102._0_16_);
    uVar68 = vcmpps_avx512vl(auVar124,auVar273,5);
    bVar60 = (byte)uVar68;
    if (bVar60 == 0) {
LAB_018cfdc9:
      auVar237 = ZEXT3264(_DAT_01f7b040);
      auVar103 = vmovdqa64_avx512vl(auVar91);
      auVar270 = ZEXT3264(auVar103);
      auVar271 = ZEXT3264(local_840);
      auVar272 = ZEXT3264(local_860);
    }
    else {
      auVar124 = vsqrtps_avx512vl(auVar124);
      local_7e0 = vaddps_avx512vl(auVar119,auVar119);
      _local_580 = vrcp14ps_avx512vl(local_7e0);
      auVar102._8_4_ = 0x3f800000;
      auVar102._0_8_ = 0x3f8000003f800000;
      auVar102._12_4_ = 0x3f800000;
      auVar102._16_4_ = 0x3f800000;
      auVar102._20_4_ = 0x3f800000;
      auVar102._24_4_ = 0x3f800000;
      auVar102._28_4_ = 0x3f800000;
      auVar102 = vfnmadd213ps_avx512vl(_local_580,local_7e0,auVar102);
      auVar102 = vfmadd132ps_avx512vl(auVar102,_local_580,_local_580);
      local_5a0 = vxorps_avx512vl(auVar123,auVar110);
      auVar110 = vsubps_avx512vl(local_5a0,auVar124);
      local_560 = vmulps_avx512vl(auVar110,auVar102);
      auVar110 = vsubps_avx512vl(auVar124,auVar123);
      local_5c0 = vmulps_avx512vl(auVar110,auVar102);
      auVar110 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar124 = vblendmps_avx512vl(auVar110,local_560);
      auVar127._0_4_ =
           (uint)(bVar60 & 1) * auVar124._0_4_ | (uint)!(bool)(bVar60 & 1) * auVar110._0_4_;
      bVar67 = (bool)((byte)(uVar68 >> 1) & 1);
      auVar127._4_4_ = (uint)bVar67 * auVar124._4_4_ | (uint)!bVar67 * auVar110._4_4_;
      bVar67 = (bool)((byte)(uVar68 >> 2) & 1);
      auVar127._8_4_ = (uint)bVar67 * auVar124._8_4_ | (uint)!bVar67 * auVar110._8_4_;
      bVar67 = (bool)((byte)(uVar68 >> 3) & 1);
      auVar127._12_4_ = (uint)bVar67 * auVar124._12_4_ | (uint)!bVar67 * auVar110._12_4_;
      bVar67 = (bool)((byte)(uVar68 >> 4) & 1);
      auVar127._16_4_ = (uint)bVar67 * auVar124._16_4_ | (uint)!bVar67 * auVar110._16_4_;
      bVar67 = (bool)((byte)(uVar68 >> 5) & 1);
      auVar127._20_4_ = (uint)bVar67 * auVar124._20_4_ | (uint)!bVar67 * auVar110._20_4_;
      bVar67 = (bool)((byte)(uVar68 >> 6) & 1);
      auVar127._24_4_ = (uint)bVar67 * auVar124._24_4_ | (uint)!bVar67 * auVar110._24_4_;
      bVar67 = SUB81(uVar68 >> 7,0);
      auVar127._28_4_ = (uint)bVar67 * auVar124._28_4_ | (uint)!bVar67 * auVar110._28_4_;
      auVar110 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar124 = vblendmps_avx512vl(auVar110,local_5c0);
      auVar128._0_4_ =
           (uint)(bVar60 & 1) * auVar124._0_4_ | (uint)!(bool)(bVar60 & 1) * auVar110._0_4_;
      bVar67 = (bool)((byte)(uVar68 >> 1) & 1);
      auVar128._4_4_ = (uint)bVar67 * auVar124._4_4_ | (uint)!bVar67 * auVar110._4_4_;
      bVar67 = (bool)((byte)(uVar68 >> 2) & 1);
      auVar128._8_4_ = (uint)bVar67 * auVar124._8_4_ | (uint)!bVar67 * auVar110._8_4_;
      bVar67 = (bool)((byte)(uVar68 >> 3) & 1);
      auVar128._12_4_ = (uint)bVar67 * auVar124._12_4_ | (uint)!bVar67 * auVar110._12_4_;
      bVar67 = (bool)((byte)(uVar68 >> 4) & 1);
      auVar128._16_4_ = (uint)bVar67 * auVar124._16_4_ | (uint)!bVar67 * auVar110._16_4_;
      bVar67 = (bool)((byte)(uVar68 >> 5) & 1);
      auVar128._20_4_ = (uint)bVar67 * auVar124._20_4_ | (uint)!bVar67 * auVar110._20_4_;
      bVar67 = (bool)((byte)(uVar68 >> 6) & 1);
      auVar128._24_4_ = (uint)bVar67 * auVar124._24_4_ | (uint)!bVar67 * auVar110._24_4_;
      bVar67 = SUB81(uVar68 >> 7,0);
      auVar128._28_4_ = (uint)bVar67 * auVar124._28_4_ | (uint)!bVar67 * auVar110._28_4_;
      auVar110 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar118,auVar110);
      local_5e0 = vmaxps_avx512vl(local_240,auVar110);
      auVar273._8_4_ = 0x36000000;
      auVar273._0_8_ = 0x3600000036000000;
      auVar273._12_4_ = 0x36000000;
      auVar273._16_4_ = 0x36000000;
      auVar273._20_4_ = 0x36000000;
      auVar273._24_4_ = 0x36000000;
      auVar273._28_4_ = 0x36000000;
      local_600 = vmulps_avx512vl(local_5e0,auVar273);
      vandps_avx512vl(auVar119,auVar110);
      uVar24 = vcmpps_avx512vl(local_600,local_600,1);
      uVar68 = uVar68 & uVar24;
      bVar64 = (byte)uVar68;
      if (bVar64 != 0) {
        uVar24 = vcmpps_avx512vl(auVar100,ZEXT1632(auVar84),2);
        auVar100 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar118 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar119 = vblendmps_avx512vl(auVar100,auVar118);
        bVar63 = (byte)uVar24;
        uVar69 = (uint)(bVar63 & 1) * auVar119._0_4_ | (uint)!(bool)(bVar63 & 1) * local_600._0_4_;
        bVar67 = (bool)((byte)(uVar24 >> 1) & 1);
        uVar141 = (uint)bVar67 * auVar119._4_4_ | (uint)!bVar67 * local_600._4_4_;
        bVar67 = (bool)((byte)(uVar24 >> 2) & 1);
        uVar142 = (uint)bVar67 * auVar119._8_4_ | (uint)!bVar67 * local_600._8_4_;
        bVar67 = (bool)((byte)(uVar24 >> 3) & 1);
        uVar143 = (uint)bVar67 * auVar119._12_4_ | (uint)!bVar67 * local_600._12_4_;
        bVar67 = (bool)((byte)(uVar24 >> 4) & 1);
        uVar144 = (uint)bVar67 * auVar119._16_4_ | (uint)!bVar67 * local_600._16_4_;
        bVar67 = (bool)((byte)(uVar24 >> 5) & 1);
        uVar145 = (uint)bVar67 * auVar119._20_4_ | (uint)!bVar67 * local_600._20_4_;
        bVar67 = (bool)((byte)(uVar24 >> 6) & 1);
        uVar146 = (uint)bVar67 * auVar119._24_4_ | (uint)!bVar67 * local_600._24_4_;
        bVar67 = SUB81(uVar24 >> 7,0);
        uVar147 = (uint)bVar67 * auVar119._28_4_ | (uint)!bVar67 * local_600._28_4_;
        auVar127._0_4_ = (bVar64 & 1) * uVar69 | !(bool)(bVar64 & 1) * auVar127._0_4_;
        bVar67 = (bool)((byte)(uVar68 >> 1) & 1);
        auVar127._4_4_ = bVar67 * uVar141 | !bVar67 * auVar127._4_4_;
        bVar67 = (bool)((byte)(uVar68 >> 2) & 1);
        auVar127._8_4_ = bVar67 * uVar142 | !bVar67 * auVar127._8_4_;
        bVar67 = (bool)((byte)(uVar68 >> 3) & 1);
        auVar127._12_4_ = bVar67 * uVar143 | !bVar67 * auVar127._12_4_;
        bVar67 = (bool)((byte)(uVar68 >> 4) & 1);
        auVar127._16_4_ = bVar67 * uVar144 | !bVar67 * auVar127._16_4_;
        bVar67 = (bool)((byte)(uVar68 >> 5) & 1);
        auVar127._20_4_ = bVar67 * uVar145 | !bVar67 * auVar127._20_4_;
        bVar67 = (bool)((byte)(uVar68 >> 6) & 1);
        auVar127._24_4_ = bVar67 * uVar146 | !bVar67 * auVar127._24_4_;
        bVar67 = SUB81(uVar68 >> 7,0);
        auVar127._28_4_ = bVar67 * uVar147 | !bVar67 * auVar127._28_4_;
        auVar100 = vblendmps_avx512vl(auVar118,auVar100);
        bVar67 = (bool)((byte)(uVar24 >> 1) & 1);
        bVar11 = (bool)((byte)(uVar24 >> 2) & 1);
        bVar12 = (bool)((byte)(uVar24 >> 3) & 1);
        bVar13 = (bool)((byte)(uVar24 >> 4) & 1);
        bVar14 = (bool)((byte)(uVar24 >> 5) & 1);
        bVar15 = (bool)((byte)(uVar24 >> 6) & 1);
        bVar16 = SUB81(uVar24 >> 7,0);
        auVar128._0_4_ =
             (uint)(bVar64 & 1) *
             ((uint)(bVar63 & 1) * auVar100._0_4_ | !(bool)(bVar63 & 1) * uVar69) |
             !(bool)(bVar64 & 1) * auVar128._0_4_;
        bVar10 = (bool)((byte)(uVar68 >> 1) & 1);
        auVar128._4_4_ =
             (uint)bVar10 * ((uint)bVar67 * auVar100._4_4_ | !bVar67 * uVar141) |
             !bVar10 * auVar128._4_4_;
        bVar67 = (bool)((byte)(uVar68 >> 2) & 1);
        auVar128._8_4_ =
             (uint)bVar67 * ((uint)bVar11 * auVar100._8_4_ | !bVar11 * uVar142) |
             !bVar67 * auVar128._8_4_;
        bVar67 = (bool)((byte)(uVar68 >> 3) & 1);
        auVar128._12_4_ =
             (uint)bVar67 * ((uint)bVar12 * auVar100._12_4_ | !bVar12 * uVar143) |
             !bVar67 * auVar128._12_4_;
        bVar67 = (bool)((byte)(uVar68 >> 4) & 1);
        auVar128._16_4_ =
             (uint)bVar67 * ((uint)bVar13 * auVar100._16_4_ | !bVar13 * uVar144) |
             !bVar67 * auVar128._16_4_;
        bVar67 = (bool)((byte)(uVar68 >> 5) & 1);
        auVar128._20_4_ =
             (uint)bVar67 * ((uint)bVar14 * auVar100._20_4_ | !bVar14 * uVar145) |
             !bVar67 * auVar128._20_4_;
        bVar67 = (bool)((byte)(uVar68 >> 6) & 1);
        auVar128._24_4_ =
             (uint)bVar67 * ((uint)bVar15 * auVar100._24_4_ | !bVar15 * uVar146) |
             !bVar67 * auVar128._24_4_;
        bVar67 = SUB81(uVar68 >> 7,0);
        auVar128._28_4_ =
             (uint)bVar67 * ((uint)bVar16 * auVar100._28_4_ | !bVar16 * uVar147) |
             !bVar67 * auVar128._28_4_;
        bVar60 = (~bVar64 | bVar63) & bVar60;
      }
      if ((bVar60 & 0x7f) == 0) {
        auVar237 = ZEXT3264(_DAT_01f7b040);
        auVar103 = vmovdqa64_avx512vl(auVar91);
        auVar270 = ZEXT3264(auVar103);
        auVar271 = ZEXT3264(local_840);
        auVar272 = ZEXT3264(local_860);
      }
      else {
        auVar100 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar118 = vxorps_avx512vl(auVar117,auVar100);
        auVar119 = vxorps_avx512vl(auVar115,auVar100);
        auVar237 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
        auVar110 = vxorps_avx512vl(auVar116,auVar100);
        auVar84 = vsubss_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                                 ZEXT416((uint)local_660._0_4_));
        auVar115 = vbroadcastss_avx512vl(auVar84);
        auVar115 = vminps_avx512vl(auVar115,auVar128);
        auVar59._4_4_ = fStack_2dc;
        auVar59._0_4_ = local_2e0;
        auVar59._8_4_ = fStack_2d8;
        auVar59._12_4_ = fStack_2d4;
        auVar59._16_4_ = fStack_2d0;
        auVar59._20_4_ = fStack_2cc;
        auVar59._24_4_ = fStack_2c8;
        auVar59._28_4_ = fStack_2c4;
        auVar116 = vmaxps_avx512vl(auVar59,auVar127);
        auVar117 = vmulps_avx512vl(auVar131,auVar122);
        auVar117 = vfmadd213ps_avx512vl(auVar121,auVar130,auVar117);
        auVar84 = vfmadd213ps_fma(auVar120,auVar129,auVar117);
        auVar120 = vmulps_avx512vl(local_460,auVar131);
        auVar120 = vfmadd231ps_avx512vl(auVar120,local_360,auVar130);
        auVar120 = vfmadd231ps_avx512vl(auVar120,local_440,auVar129);
        auVar117 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        vandps_avx512vl(auVar120,auVar117);
        auVar121 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
        uVar23 = vcmpps_avx512vl(auVar117,auVar121,1);
        auVar122 = vxorps_avx512vl(ZEXT1632(auVar84),auVar100);
        auVar129 = vrcp14ps_avx512vl(auVar120);
        auVar130 = vxorps_avx512vl(auVar120,auVar100);
        auVar131 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar124 = vfnmadd213ps_avx512vl(auVar129,auVar120,auVar131);
        auVar84 = vfmadd132ps_fma(auVar124,auVar129,auVar129);
        fVar245 = auVar84._0_4_ * auVar122._0_4_;
        fVar248 = auVar84._4_4_ * auVar122._4_4_;
        auVar40._4_4_ = fVar248;
        auVar40._0_4_ = fVar245;
        fVar249 = auVar84._8_4_ * auVar122._8_4_;
        auVar40._8_4_ = fVar249;
        fVar250 = auVar84._12_4_ * auVar122._12_4_;
        auVar40._12_4_ = fVar250;
        fVar222 = auVar122._16_4_ * 0.0;
        auVar40._16_4_ = fVar222;
        fVar223 = auVar122._20_4_ * 0.0;
        auVar40._20_4_ = fVar223;
        fVar224 = auVar122._24_4_ * 0.0;
        auVar40._24_4_ = fVar224;
        auVar40._28_4_ = auVar122._28_4_;
        uVar26 = vcmpps_avx512vl(auVar120,auVar130,1);
        bVar64 = (byte)uVar23 | (byte)uVar26;
        auVar124 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar102 = vblendmps_avx512vl(auVar40,auVar124);
        auVar132._0_4_ =
             (uint)(bVar64 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar64 & 1) * auVar129._0_4_;
        bVar67 = (bool)(bVar64 >> 1 & 1);
        auVar132._4_4_ = (uint)bVar67 * auVar102._4_4_ | (uint)!bVar67 * auVar129._4_4_;
        bVar67 = (bool)(bVar64 >> 2 & 1);
        auVar132._8_4_ = (uint)bVar67 * auVar102._8_4_ | (uint)!bVar67 * auVar129._8_4_;
        bVar67 = (bool)(bVar64 >> 3 & 1);
        auVar132._12_4_ = (uint)bVar67 * auVar102._12_4_ | (uint)!bVar67 * auVar129._12_4_;
        bVar67 = (bool)(bVar64 >> 4 & 1);
        auVar132._16_4_ = (uint)bVar67 * auVar102._16_4_ | (uint)!bVar67 * auVar129._16_4_;
        bVar67 = (bool)(bVar64 >> 5 & 1);
        auVar132._20_4_ = (uint)bVar67 * auVar102._20_4_ | (uint)!bVar67 * auVar129._20_4_;
        bVar67 = (bool)(bVar64 >> 6 & 1);
        auVar132._24_4_ = (uint)bVar67 * auVar102._24_4_ | (uint)!bVar67 * auVar129._24_4_;
        auVar132._28_4_ =
             (uint)(bVar64 >> 7) * auVar102._28_4_ | (uint)!(bool)(bVar64 >> 7) * auVar129._28_4_;
        auVar129 = vmaxps_avx512vl(auVar116,auVar132);
        auVar265 = ZEXT3264(auVar129);
        uVar26 = vcmpps_avx512vl(auVar120,auVar130,6);
        bVar64 = (byte)uVar23 | (byte)uVar26;
        auVar133._0_4_ = (uint)(bVar64 & 1) * 0x7f800000 | (uint)!(bool)(bVar64 & 1) * (int)fVar245;
        bVar67 = (bool)(bVar64 >> 1 & 1);
        auVar133._4_4_ = (uint)bVar67 * 0x7f800000 | (uint)!bVar67 * (int)fVar248;
        bVar67 = (bool)(bVar64 >> 2 & 1);
        auVar133._8_4_ = (uint)bVar67 * 0x7f800000 | (uint)!bVar67 * (int)fVar249;
        bVar67 = (bool)(bVar64 >> 3 & 1);
        auVar133._12_4_ = (uint)bVar67 * 0x7f800000 | (uint)!bVar67 * (int)fVar250;
        bVar67 = (bool)(bVar64 >> 4 & 1);
        auVar133._16_4_ = (uint)bVar67 * 0x7f800000 | (uint)!bVar67 * (int)fVar222;
        bVar67 = (bool)(bVar64 >> 5 & 1);
        auVar133._20_4_ = (uint)bVar67 * 0x7f800000 | (uint)!bVar67 * (int)fVar223;
        bVar67 = (bool)(bVar64 >> 6 & 1);
        auVar133._24_4_ = (uint)bVar67 * 0x7f800000 | (uint)!bVar67 * (int)fVar224;
        auVar133._28_4_ =
             (uint)(bVar64 >> 7) * 0x7f800000 | (uint)!(bool)(bVar64 >> 7) * auVar122._28_4_;
        auVar120 = vminps_avx512vl(auVar115,auVar133);
        auVar84 = vxorps_avx512vl(auVar116._0_16_,auVar116._0_16_);
        auVar111 = vsubps_avx512vl(ZEXT1632(auVar84),auVar111);
        auVar112 = vsubps_avx512vl(ZEXT1632(auVar84),auVar112);
        auVar115 = ZEXT1632(auVar84);
        auVar113 = vsubps_avx512vl(auVar115,auVar113);
        auVar113 = vmulps_avx512vl(auVar113,auVar118);
        auVar112 = vfmadd231ps_avx512vl(auVar113,auVar110,auVar112);
        auVar111 = vfmadd231ps_avx512vl(auVar112,auVar119,auVar111);
        auVar118 = vmulps_avx512vl(local_460,auVar118);
        auVar118 = vfmadd231ps_avx512vl(auVar118,local_360,auVar110);
        auVar118 = vfmadd231ps_avx512vl(auVar118,local_440,auVar119);
        vandps_avx512vl(auVar118,auVar117);
        uVar23 = vcmpps_avx512vl(auVar118,auVar121,1);
        auVar119 = vxorps_avx512vl(auVar111,auVar100);
        auVar110 = vrcp14ps_avx512vl(auVar118);
        auVar100 = vxorps_avx512vl(auVar118,auVar100);
        auVar260 = ZEXT3264(auVar100);
        auVar111 = vfnmadd213ps_avx512vl(auVar110,auVar118,auVar131);
        auVar84 = vfmadd132ps_fma(auVar111,auVar110,auVar110);
        fVar245 = auVar84._0_4_ * auVar119._0_4_;
        fVar248 = auVar84._4_4_ * auVar119._4_4_;
        auVar41._4_4_ = fVar248;
        auVar41._0_4_ = fVar245;
        fVar249 = auVar84._8_4_ * auVar119._8_4_;
        auVar41._8_4_ = fVar249;
        fVar250 = auVar84._12_4_ * auVar119._12_4_;
        auVar41._12_4_ = fVar250;
        fVar222 = auVar119._16_4_ * 0.0;
        auVar41._16_4_ = fVar222;
        fVar223 = auVar119._20_4_ * 0.0;
        auVar41._20_4_ = fVar223;
        fVar224 = auVar119._24_4_ * 0.0;
        auVar41._24_4_ = fVar224;
        auVar41._28_4_ = auVar119._28_4_;
        uVar26 = vcmpps_avx512vl(auVar118,auVar100,1);
        bVar64 = (byte)uVar23 | (byte)uVar26;
        auVar111 = vblendmps_avx512vl(auVar41,auVar124);
        auVar134._0_4_ =
             (uint)(bVar64 & 1) * auVar111._0_4_ | (uint)!(bool)(bVar64 & 1) * auVar110._0_4_;
        bVar67 = (bool)(bVar64 >> 1 & 1);
        auVar134._4_4_ = (uint)bVar67 * auVar111._4_4_ | (uint)!bVar67 * auVar110._4_4_;
        bVar67 = (bool)(bVar64 >> 2 & 1);
        auVar134._8_4_ = (uint)bVar67 * auVar111._8_4_ | (uint)!bVar67 * auVar110._8_4_;
        bVar67 = (bool)(bVar64 >> 3 & 1);
        auVar134._12_4_ = (uint)bVar67 * auVar111._12_4_ | (uint)!bVar67 * auVar110._12_4_;
        bVar67 = (bool)(bVar64 >> 4 & 1);
        auVar134._16_4_ = (uint)bVar67 * auVar111._16_4_ | (uint)!bVar67 * auVar110._16_4_;
        bVar67 = (bool)(bVar64 >> 5 & 1);
        auVar134._20_4_ = (uint)bVar67 * auVar111._20_4_ | (uint)!bVar67 * auVar110._20_4_;
        bVar67 = (bool)(bVar64 >> 6 & 1);
        auVar134._24_4_ = (uint)bVar67 * auVar111._24_4_ | (uint)!bVar67 * auVar110._24_4_;
        auVar134._28_4_ =
             (uint)(bVar64 >> 7) * auVar111._28_4_ | (uint)!(bool)(bVar64 >> 7) * auVar110._28_4_;
        local_420 = vmaxps_avx(auVar129,auVar134);
        uVar26 = vcmpps_avx512vl(auVar118,auVar100,6);
        bVar64 = (byte)uVar23 | (byte)uVar26;
        auVar135._0_4_ = (uint)(bVar64 & 1) * 0x7f800000 | (uint)!(bool)(bVar64 & 1) * (int)fVar245;
        bVar67 = (bool)(bVar64 >> 1 & 1);
        auVar135._4_4_ = (uint)bVar67 * 0x7f800000 | (uint)!bVar67 * (int)fVar248;
        bVar67 = (bool)(bVar64 >> 2 & 1);
        auVar135._8_4_ = (uint)bVar67 * 0x7f800000 | (uint)!bVar67 * (int)fVar249;
        bVar67 = (bool)(bVar64 >> 3 & 1);
        auVar135._12_4_ = (uint)bVar67 * 0x7f800000 | (uint)!bVar67 * (int)fVar250;
        bVar67 = (bool)(bVar64 >> 4 & 1);
        auVar135._16_4_ = (uint)bVar67 * 0x7f800000 | (uint)!bVar67 * (int)fVar222;
        bVar67 = (bool)(bVar64 >> 5 & 1);
        auVar135._20_4_ = (uint)bVar67 * 0x7f800000 | (uint)!bVar67 * (int)fVar223;
        bVar67 = (bool)(bVar64 >> 6 & 1);
        auVar135._24_4_ = (uint)bVar67 * 0x7f800000 | (uint)!bVar67 * (int)fVar224;
        auVar135._28_4_ =
             (uint)(bVar64 >> 7) * 0x7f800000 | (uint)!(bool)(bVar64 >> 7) * auVar119._28_4_;
        local_320 = vminps_avx(auVar120,auVar135);
        auVar252 = ZEXT3264(local_320);
        uVar23 = vcmpps_avx512vl(local_420,local_320,2);
        bVar60 = bVar60 & 0x7f & (byte)uVar23;
        if (bVar60 == 0) goto LAB_018cfdc9;
        auVar100 = vmaxps_avx512vl(auVar115,auVar103);
        auVar103 = vfmadd213ps_avx512vl(local_560,auVar125,auVar114);
        fVar245 = auVar106._0_4_;
        fVar248 = auVar106._4_4_;
        auVar42._4_4_ = fVar248 * auVar103._4_4_;
        auVar42._0_4_ = fVar245 * auVar103._0_4_;
        fVar249 = auVar106._8_4_;
        auVar42._8_4_ = fVar249 * auVar103._8_4_;
        fVar250 = auVar106._12_4_;
        auVar42._12_4_ = fVar250 * auVar103._12_4_;
        fVar222 = auVar106._16_4_;
        auVar42._16_4_ = fVar222 * auVar103._16_4_;
        fVar223 = auVar106._20_4_;
        auVar42._20_4_ = fVar223 * auVar103._20_4_;
        fVar224 = auVar106._24_4_;
        auVar42._24_4_ = fVar224 * auVar103._24_4_;
        auVar42._28_4_ = auVar103._28_4_;
        auVar103 = vfmadd213ps_avx512vl(local_5c0,auVar125,auVar114);
        auVar43._4_4_ = fVar248 * auVar103._4_4_;
        auVar43._0_4_ = fVar245 * auVar103._0_4_;
        auVar43._8_4_ = fVar249 * auVar103._8_4_;
        auVar43._12_4_ = fVar250 * auVar103._12_4_;
        auVar43._16_4_ = fVar222 * auVar103._16_4_;
        auVar43._20_4_ = fVar223 * auVar103._20_4_;
        auVar43._24_4_ = fVar224 * auVar103._24_4_;
        auVar43._28_4_ = auVar103._28_4_;
        auVar103 = vminps_avx512vl(auVar42,auVar131);
        auVar51 = ZEXT812(0);
        auVar118 = ZEXT1232(auVar51) << 0x20;
        auVar103 = vmaxps_avx(auVar103,ZEXT1232(auVar51) << 0x20);
        auVar119 = vminps_avx512vl(auVar43,auVar131);
        auVar44._4_4_ = (auVar103._4_4_ + 1.0) * 0.125;
        auVar44._0_4_ = (auVar103._0_4_ + 0.0) * 0.125;
        auVar44._8_4_ = (auVar103._8_4_ + 2.0) * 0.125;
        auVar44._12_4_ = (auVar103._12_4_ + 3.0) * 0.125;
        auVar44._16_4_ = (auVar103._16_4_ + 4.0) * 0.125;
        auVar44._20_4_ = (auVar103._20_4_ + 5.0) * 0.125;
        auVar44._24_4_ = (auVar103._24_4_ + 6.0) * 0.125;
        auVar44._28_4_ = auVar103._28_4_ + 7.0;
        local_1a0 = vfmadd213ps_avx512vl(auVar44,local_720,local_780);
        auVar103 = vmaxps_avx(auVar119,ZEXT1232(auVar51) << 0x20);
        auVar45._4_4_ = (auVar103._4_4_ + 1.0) * 0.125;
        auVar45._0_4_ = (auVar103._0_4_ + 0.0) * 0.125;
        auVar45._8_4_ = (auVar103._8_4_ + 2.0) * 0.125;
        auVar45._12_4_ = (auVar103._12_4_ + 3.0) * 0.125;
        auVar45._16_4_ = (auVar103._16_4_ + 4.0) * 0.125;
        auVar45._20_4_ = (auVar103._20_4_ + 5.0) * 0.125;
        auVar45._24_4_ = (auVar103._24_4_ + 6.0) * 0.125;
        auVar45._28_4_ = auVar103._28_4_ + 7.0;
        local_1c0 = vfmadd213ps_avx512vl(auVar45,local_720,local_780);
        auVar46._4_4_ = auVar100._4_4_ * auVar100._4_4_;
        auVar46._0_4_ = auVar100._0_4_ * auVar100._0_4_;
        auVar46._8_4_ = auVar100._8_4_ * auVar100._8_4_;
        auVar46._12_4_ = auVar100._12_4_ * auVar100._12_4_;
        auVar46._16_4_ = auVar100._16_4_ * auVar100._16_4_;
        auVar46._20_4_ = auVar100._20_4_ * auVar100._20_4_;
        auVar46._24_4_ = auVar100._24_4_ * auVar100._24_4_;
        auVar46._28_4_ = auVar100._28_4_;
        auVar103 = vsubps_avx(local_740,auVar46);
        auVar47._4_4_ = auVar103._4_4_ * (float)local_7c0._4_4_;
        auVar47._0_4_ = auVar103._0_4_ * (float)local_7c0._0_4_;
        auVar47._8_4_ = auVar103._8_4_ * fStack_7b8;
        auVar47._12_4_ = auVar103._12_4_ * fStack_7b4;
        auVar47._16_4_ = auVar103._16_4_ * fStack_7b0;
        auVar47._20_4_ = auVar103._20_4_ * fStack_7ac;
        auVar47._24_4_ = auVar103._24_4_ * fStack_7a8;
        auVar47._28_4_ = auVar100._28_4_;
        auVar100 = vsubps_avx(local_7a0,auVar47);
        uVar23 = vcmpps_avx512vl(auVar100,ZEXT1232(auVar51) << 0x20,5);
        bVar64 = (byte)uVar23;
        auVar271 = ZEXT3264(local_840);
        auVar272 = ZEXT3264(local_860);
        if (bVar64 == 0) {
          bVar64 = 0;
          auVar101 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar244 = ZEXT864(0) << 0x20;
          auVar100 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar119 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar256 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar136._8_4_ = 0x7f800000;
          auVar136._0_8_ = 0x7f8000007f800000;
          auVar136._12_4_ = 0x7f800000;
          auVar136._16_4_ = 0x7f800000;
          auVar136._20_4_ = 0x7f800000;
          auVar136._24_4_ = 0x7f800000;
          auVar136._28_4_ = 0x7f800000;
          auVar137._8_4_ = 0xff800000;
          auVar137._0_8_ = 0xff800000ff800000;
          auVar137._12_4_ = 0xff800000;
          auVar137._16_4_ = 0xff800000;
          auVar137._20_4_ = 0xff800000;
          auVar137._24_4_ = 0xff800000;
          auVar137._28_4_ = 0xff800000;
        }
        else {
          auVar88 = vxorps_avx512vl(auVar150,auVar150);
          uVar68 = vcmpps_avx512vl(auVar100,auVar115,5);
          auVar100 = vsqrtps_avx(auVar100);
          auVar118 = vfnmadd213ps_avx512vl(local_7e0,_local_580,auVar131);
          auVar84 = vfmadd132ps_fma(auVar118,_local_580,_local_580);
          auVar118 = vsubps_avx(local_5a0,auVar100);
          auVar48._4_4_ = auVar84._4_4_ * auVar118._4_4_;
          auVar48._0_4_ = auVar84._0_4_ * auVar118._0_4_;
          auVar48._8_4_ = auVar84._8_4_ * auVar118._8_4_;
          auVar48._12_4_ = auVar84._12_4_ * auVar118._12_4_;
          auVar48._16_4_ = auVar118._16_4_ * 0.0;
          auVar48._20_4_ = auVar118._20_4_ * 0.0;
          auVar48._24_4_ = auVar118._24_4_ * 0.0;
          auVar48._28_4_ = 0x3e000000;
          auVar100 = vsubps_avx512vl(auVar100,auVar123);
          auVar49._4_4_ = auVar84._4_4_ * auVar100._4_4_;
          auVar49._0_4_ = auVar84._0_4_ * auVar100._0_4_;
          auVar49._8_4_ = auVar84._8_4_ * auVar100._8_4_;
          auVar49._12_4_ = auVar84._12_4_ * auVar100._12_4_;
          auVar49._16_4_ = auVar100._16_4_ * 0.0;
          auVar49._20_4_ = auVar100._20_4_ * 0.0;
          auVar49._24_4_ = auVar100._24_4_ * 0.0;
          auVar49._28_4_ = uVar171;
          auVar100 = vfmadd213ps_avx512vl(auVar125,auVar48,auVar114);
          auVar257._0_4_ = fVar245 * auVar100._0_4_;
          auVar257._4_4_ = fVar248 * auVar100._4_4_;
          auVar257._8_4_ = fVar249 * auVar100._8_4_;
          auVar257._12_4_ = fVar250 * auVar100._12_4_;
          auVar257._16_4_ = fVar222 * auVar100._16_4_;
          auVar257._20_4_ = fVar223 * auVar100._20_4_;
          auVar257._24_4_ = fVar224 * auVar100._24_4_;
          auVar257._28_4_ = 0;
          auVar100 = vmulps_avx512vl(local_440,auVar48);
          auVar118 = vmulps_avx512vl(local_360,auVar48);
          auVar120 = vmulps_avx512vl(local_460,auVar48);
          auVar119 = vfmadd213ps_avx512vl(auVar101,auVar257,auVar107);
          auVar100 = vsubps_avx512vl(auVar100,auVar119);
          auVar119 = vfmadd213ps_avx512vl(auVar104,auVar257,auVar108);
          auVar119 = vsubps_avx512vl(auVar118,auVar119);
          auVar84 = vfmadd213ps_fma(auVar257,auVar105,auVar109);
          auVar118 = vsubps_avx(auVar120,ZEXT1632(auVar84));
          auVar256 = auVar118._0_28_;
          auVar114 = vfmadd213ps_avx512vl(auVar125,auVar49,auVar114);
          auVar106 = vmulps_avx512vl(auVar106,auVar114);
          auVar114 = vmulps_avx512vl(local_440,auVar49);
          auVar120 = vmulps_avx512vl(local_360,auVar49);
          auVar110 = vmulps_avx512vl(local_460,auVar49);
          auVar84 = vfmadd213ps_fma(auVar101,auVar106,auVar107);
          auVar118 = vsubps_avx(auVar114,ZEXT1632(auVar84));
          auVar84 = vfmadd213ps_fma(auVar104,auVar106,auVar108);
          auVar101 = vsubps_avx512vl(auVar120,ZEXT1632(auVar84));
          auVar84 = vfmadd213ps_fma(auVar105,auVar106,auVar109);
          auVar104 = vsubps_avx512vl(auVar110,ZEXT1632(auVar84));
          auVar244 = ZEXT3264(auVar104);
          auVar157._8_4_ = 0x7f800000;
          auVar157._0_8_ = 0x7f8000007f800000;
          auVar157._12_4_ = 0x7f800000;
          auVar157._16_4_ = 0x7f800000;
          auVar157._20_4_ = 0x7f800000;
          auVar157._24_4_ = 0x7f800000;
          auVar157._28_4_ = 0x7f800000;
          auVar104 = vblendmps_avx512vl(auVar157,auVar48);
          bVar67 = (bool)((byte)uVar68 & 1);
          auVar136._0_4_ = (uint)bVar67 * auVar104._0_4_ | (uint)!bVar67 * auVar107._0_4_;
          bVar67 = (bool)((byte)(uVar68 >> 1) & 1);
          auVar136._4_4_ = (uint)bVar67 * auVar104._4_4_ | (uint)!bVar67 * auVar107._4_4_;
          bVar67 = (bool)((byte)(uVar68 >> 2) & 1);
          auVar136._8_4_ = (uint)bVar67 * auVar104._8_4_ | (uint)!bVar67 * auVar107._8_4_;
          bVar67 = (bool)((byte)(uVar68 >> 3) & 1);
          auVar136._12_4_ = (uint)bVar67 * auVar104._12_4_ | (uint)!bVar67 * auVar107._12_4_;
          bVar67 = (bool)((byte)(uVar68 >> 4) & 1);
          auVar136._16_4_ = (uint)bVar67 * auVar104._16_4_ | (uint)!bVar67 * auVar107._16_4_;
          bVar67 = (bool)((byte)(uVar68 >> 5) & 1);
          auVar136._20_4_ = (uint)bVar67 * auVar104._20_4_ | (uint)!bVar67 * auVar107._20_4_;
          bVar67 = (bool)((byte)(uVar68 >> 6) & 1);
          auVar136._24_4_ = (uint)bVar67 * auVar104._24_4_ | (uint)!bVar67 * auVar107._24_4_;
          bVar67 = SUB81(uVar68 >> 7,0);
          auVar136._28_4_ = (uint)bVar67 * auVar104._28_4_ | (uint)!bVar67 * auVar107._28_4_;
          auVar158._8_4_ = 0xff800000;
          auVar158._0_8_ = 0xff800000ff800000;
          auVar158._12_4_ = 0xff800000;
          auVar158._16_4_ = 0xff800000;
          auVar158._20_4_ = 0xff800000;
          auVar158._24_4_ = 0xff800000;
          auVar158._28_4_ = 0xff800000;
          auVar104 = vblendmps_avx512vl(auVar158,auVar49);
          bVar67 = (bool)((byte)uVar68 & 1);
          auVar137._0_4_ = (uint)bVar67 * auVar104._0_4_ | (uint)!bVar67 * -0x800000;
          bVar67 = (bool)((byte)(uVar68 >> 1) & 1);
          auVar137._4_4_ = (uint)bVar67 * auVar104._4_4_ | (uint)!bVar67 * -0x800000;
          bVar67 = (bool)((byte)(uVar68 >> 2) & 1);
          auVar137._8_4_ = (uint)bVar67 * auVar104._8_4_ | (uint)!bVar67 * -0x800000;
          bVar67 = (bool)((byte)(uVar68 >> 3) & 1);
          auVar137._12_4_ = (uint)bVar67 * auVar104._12_4_ | (uint)!bVar67 * -0x800000;
          bVar67 = (bool)((byte)(uVar68 >> 4) & 1);
          auVar137._16_4_ = (uint)bVar67 * auVar104._16_4_ | (uint)!bVar67 * -0x800000;
          bVar67 = (bool)((byte)(uVar68 >> 5) & 1);
          auVar137._20_4_ = (uint)bVar67 * auVar104._20_4_ | (uint)!bVar67 * -0x800000;
          bVar67 = (bool)((byte)(uVar68 >> 6) & 1);
          auVar137._24_4_ = (uint)bVar67 * auVar104._24_4_ | (uint)!bVar67 * -0x800000;
          bVar67 = SUB81(uVar68 >> 7,0);
          auVar137._28_4_ = (uint)bVar67 * auVar104._28_4_ | (uint)!bVar67 * -0x800000;
          auVar35._8_4_ = 0x36000000;
          auVar35._0_8_ = 0x3600000036000000;
          auVar35._12_4_ = 0x36000000;
          auVar35._16_4_ = 0x36000000;
          auVar35._20_4_ = 0x36000000;
          auVar35._24_4_ = 0x36000000;
          auVar35._28_4_ = 0x36000000;
          auVar104 = vmulps_avx512vl(local_5e0,auVar35);
          uVar24 = vcmpps_avx512vl(auVar104,local_600,0xe);
          uVar68 = uVar68 & uVar24;
          bVar63 = (byte)uVar68;
          if (bVar63 != 0) {
            uVar24 = vcmpps_avx512vl(auVar103,ZEXT1632(auVar88),2);
            auVar246._8_4_ = 0x7f800000;
            auVar246._0_8_ = 0x7f8000007f800000;
            auVar246._12_4_ = 0x7f800000;
            auVar246._16_4_ = 0x7f800000;
            auVar246._20_4_ = 0x7f800000;
            auVar246._24_4_ = 0x7f800000;
            auVar246._28_4_ = 0x7f800000;
            auVar264._8_4_ = 0xff800000;
            auVar264._0_8_ = 0xff800000ff800000;
            auVar264._12_4_ = 0xff800000;
            auVar264._16_4_ = 0xff800000;
            auVar264._20_4_ = 0xff800000;
            auVar264._24_4_ = 0xff800000;
            auVar264._28_4_ = 0xff800000;
            auVar103 = vblendmps_avx512vl(auVar246,auVar264);
            bVar61 = (byte)uVar24;
            uVar69 = (uint)(bVar61 & 1) * auVar103._0_4_ |
                     (uint)!(bool)(bVar61 & 1) * auVar104._0_4_;
            bVar67 = (bool)((byte)(uVar24 >> 1) & 1);
            uVar141 = (uint)bVar67 * auVar103._4_4_ | (uint)!bVar67 * auVar104._4_4_;
            bVar67 = (bool)((byte)(uVar24 >> 2) & 1);
            uVar142 = (uint)bVar67 * auVar103._8_4_ | (uint)!bVar67 * auVar104._8_4_;
            bVar67 = (bool)((byte)(uVar24 >> 3) & 1);
            uVar143 = (uint)bVar67 * auVar103._12_4_ | (uint)!bVar67 * auVar104._12_4_;
            bVar67 = (bool)((byte)(uVar24 >> 4) & 1);
            uVar144 = (uint)bVar67 * auVar103._16_4_ | (uint)!bVar67 * auVar104._16_4_;
            bVar67 = (bool)((byte)(uVar24 >> 5) & 1);
            uVar145 = (uint)bVar67 * auVar103._20_4_ | (uint)!bVar67 * auVar104._20_4_;
            bVar67 = (bool)((byte)(uVar24 >> 6) & 1);
            uVar146 = (uint)bVar67 * auVar103._24_4_ | (uint)!bVar67 * auVar104._24_4_;
            bVar67 = SUB81(uVar24 >> 7,0);
            uVar147 = (uint)bVar67 * auVar103._28_4_ | (uint)!bVar67 * auVar104._28_4_;
            auVar136._0_4_ = (bVar63 & 1) * uVar69 | !(bool)(bVar63 & 1) * auVar136._0_4_;
            bVar67 = (bool)((byte)(uVar68 >> 1) & 1);
            auVar136._4_4_ = bVar67 * uVar141 | !bVar67 * auVar136._4_4_;
            bVar67 = (bool)((byte)(uVar68 >> 2) & 1);
            auVar136._8_4_ = bVar67 * uVar142 | !bVar67 * auVar136._8_4_;
            bVar67 = (bool)((byte)(uVar68 >> 3) & 1);
            auVar136._12_4_ = bVar67 * uVar143 | !bVar67 * auVar136._12_4_;
            bVar67 = (bool)((byte)(uVar68 >> 4) & 1);
            auVar136._16_4_ = bVar67 * uVar144 | !bVar67 * auVar136._16_4_;
            bVar67 = (bool)((byte)(uVar68 >> 5) & 1);
            auVar136._20_4_ = bVar67 * uVar145 | !bVar67 * auVar136._20_4_;
            bVar67 = (bool)((byte)(uVar68 >> 6) & 1);
            auVar136._24_4_ = bVar67 * uVar146 | !bVar67 * auVar136._24_4_;
            bVar67 = SUB81(uVar68 >> 7,0);
            auVar136._28_4_ = bVar67 * uVar147 | !bVar67 * auVar136._28_4_;
            auVar103 = vblendmps_avx512vl(auVar264,auVar246);
            bVar67 = (bool)((byte)(uVar24 >> 1) & 1);
            bVar11 = (bool)((byte)(uVar24 >> 2) & 1);
            bVar12 = (bool)((byte)(uVar24 >> 3) & 1);
            bVar13 = (bool)((byte)(uVar24 >> 4) & 1);
            bVar14 = (bool)((byte)(uVar24 >> 5) & 1);
            bVar15 = (bool)((byte)(uVar24 >> 6) & 1);
            bVar16 = SUB81(uVar24 >> 7,0);
            auVar137._0_4_ =
                 (uint)(bVar63 & 1) *
                 ((uint)(bVar61 & 1) * auVar103._0_4_ | !(bool)(bVar61 & 1) * uVar69) |
                 !(bool)(bVar63 & 1) * auVar137._0_4_;
            bVar10 = (bool)((byte)(uVar68 >> 1) & 1);
            auVar137._4_4_ =
                 (uint)bVar10 * ((uint)bVar67 * auVar103._4_4_ | !bVar67 * uVar141) |
                 !bVar10 * auVar137._4_4_;
            bVar67 = (bool)((byte)(uVar68 >> 2) & 1);
            auVar137._8_4_ =
                 (uint)bVar67 * ((uint)bVar11 * auVar103._8_4_ | !bVar11 * uVar142) |
                 !bVar67 * auVar137._8_4_;
            bVar67 = (bool)((byte)(uVar68 >> 3) & 1);
            auVar137._12_4_ =
                 (uint)bVar67 * ((uint)bVar12 * auVar103._12_4_ | !bVar12 * uVar143) |
                 !bVar67 * auVar137._12_4_;
            bVar67 = (bool)((byte)(uVar68 >> 4) & 1);
            auVar137._16_4_ =
                 (uint)bVar67 * ((uint)bVar13 * auVar103._16_4_ | !bVar13 * uVar144) |
                 !bVar67 * auVar137._16_4_;
            bVar67 = (bool)((byte)(uVar68 >> 5) & 1);
            auVar137._20_4_ =
                 (uint)bVar67 * ((uint)bVar14 * auVar103._20_4_ | !bVar14 * uVar145) |
                 !bVar67 * auVar137._20_4_;
            bVar67 = (bool)((byte)(uVar68 >> 6) & 1);
            auVar137._24_4_ =
                 (uint)bVar67 * ((uint)bVar15 * auVar103._24_4_ | !bVar15 * uVar146) |
                 !bVar67 * auVar137._24_4_;
            bVar67 = SUB81(uVar68 >> 7,0);
            auVar137._28_4_ =
                 (uint)bVar67 * ((uint)bVar16 * auVar103._28_4_ | !bVar16 * uVar147) |
                 !bVar67 * auVar137._28_4_;
            bVar64 = (~bVar63 | bVar61) & bVar64;
          }
        }
        auVar103 = vmovdqa64_avx512vl(auVar91);
        auVar270 = ZEXT3264(auVar103);
        auVar265 = ZEXT3264(local_460);
        auVar247._0_4_ = local_460._0_4_ * auVar244._0_4_;
        auVar247._4_4_ = local_460._4_4_ * auVar244._4_4_;
        auVar247._8_4_ = local_460._8_4_ * auVar244._8_4_;
        auVar247._12_4_ = local_460._12_4_ * auVar244._12_4_;
        auVar247._16_4_ = local_460._16_4_ * auVar244._16_4_;
        auVar247._20_4_ = local_460._20_4_ * auVar244._20_4_;
        auVar247._28_36_ = auVar244._28_36_;
        auVar247._24_4_ = local_460._24_4_ * auVar244._24_4_;
        auVar103 = vfmadd231ps_avx512vl(auVar247._0_32_,local_360,auVar101);
        auVar247 = ZEXT3264(local_360);
        auVar103 = vfmadd231ps_avx512vl(auVar103,local_440,auVar118);
        auVar260 = ZEXT3264(local_420);
        _local_200 = local_420;
        local_1e0 = vminps_avx(local_320,auVar136);
        auVar243._8_4_ = 0x7fffffff;
        auVar243._0_8_ = 0x7fffffff7fffffff;
        auVar243._12_4_ = 0x7fffffff;
        auVar243._16_4_ = 0x7fffffff;
        auVar243._20_4_ = 0x7fffffff;
        auVar243._24_4_ = 0x7fffffff;
        auVar243._28_4_ = 0x7fffffff;
        auVar244 = ZEXT3264(auVar243);
        auVar103 = vandps_avx(auVar103,auVar243);
        _local_340 = vmaxps_avx(local_420,auVar137);
        auVar241._8_4_ = 0x3e99999a;
        auVar241._0_8_ = 0x3e99999a3e99999a;
        auVar241._12_4_ = 0x3e99999a;
        auVar241._16_4_ = 0x3e99999a;
        auVar241._20_4_ = 0x3e99999a;
        auVar241._24_4_ = 0x3e99999a;
        auVar241._28_4_ = 0x3e99999a;
        uVar23 = vcmpps_avx512vl(auVar103,auVar241,1);
        uVar26 = vcmpps_avx512vl(local_420,local_1e0,2);
        bVar63 = (byte)uVar26 & bVar60;
        uVar25 = vcmpps_avx512vl(_local_340,local_320,2);
        if ((bVar60 & ((byte)uVar25 | (byte)uVar26)) != 0) {
          _local_3e0 = _local_340;
          local_870 = (uint)(byte)((byte)uVar23 | ~bVar64);
          auVar50._4_4_ = local_460._4_4_ * auVar256._4_4_;
          auVar50._0_4_ = local_460._0_4_ * auVar256._0_4_;
          auVar50._8_4_ = local_460._8_4_ * auVar256._8_4_;
          auVar50._12_4_ = local_460._12_4_ * auVar256._12_4_;
          auVar50._16_4_ = local_460._16_4_ * auVar256._16_4_;
          auVar50._20_4_ = local_460._20_4_ * auVar256._20_4_;
          auVar50._24_4_ = local_460._24_4_ * auVar256._24_4_;
          auVar50._28_4_ = local_340._28_4_;
          auVar84 = vfmadd213ps_fma(auVar119,local_360,auVar50);
          auVar103 = vfmadd213ps_avx512vl(auVar100,local_440,ZEXT1632(auVar84));
          auVar103 = vandps_avx(auVar103,auVar243);
          uVar23 = vcmpps_avx512vl(auVar103,auVar241,1);
          bVar64 = (byte)uVar23 | ~bVar64;
          auVar159._8_4_ = 2;
          auVar159._0_8_ = 0x200000002;
          auVar159._12_4_ = 2;
          auVar159._16_4_ = 2;
          auVar159._20_4_ = 2;
          auVar159._24_4_ = 2;
          auVar159._28_4_ = 2;
          auVar36._8_4_ = 3;
          auVar36._0_8_ = 0x300000003;
          auVar36._12_4_ = 3;
          auVar36._16_4_ = 3;
          auVar36._20_4_ = 3;
          auVar36._24_4_ = 3;
          auVar36._28_4_ = 3;
          auVar103 = vpblendmd_avx512vl(auVar159,auVar36);
          local_300._0_4_ = (uint)(bVar64 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar64 & 1) * 2;
          bVar67 = (bool)(bVar64 >> 1 & 1);
          local_300._4_4_ = (uint)bVar67 * auVar103._4_4_ | (uint)!bVar67 * 2;
          bVar67 = (bool)(bVar64 >> 2 & 1);
          local_300._8_4_ = (uint)bVar67 * auVar103._8_4_ | (uint)!bVar67 * 2;
          bVar67 = (bool)(bVar64 >> 3 & 1);
          local_300._12_4_ = (uint)bVar67 * auVar103._12_4_ | (uint)!bVar67 * 2;
          bVar67 = (bool)(bVar64 >> 4 & 1);
          local_300._16_4_ = (uint)bVar67 * auVar103._16_4_ | (uint)!bVar67 * 2;
          bVar67 = (bool)(bVar64 >> 5 & 1);
          local_300._20_4_ = (uint)bVar67 * auVar103._20_4_ | (uint)!bVar67 * 2;
          bVar67 = (bool)(bVar64 >> 6 & 1);
          local_300._24_4_ = (uint)bVar67 * auVar103._24_4_ | (uint)!bVar67 * 2;
          local_300._28_4_ = (uint)(bVar64 >> 7) * auVar103._28_4_ | (uint)!(bool)(bVar64 >> 7) * 2;
          local_380 = vpbroadcastd_avx512vl();
          uVar23 = vpcmpd_avx512vl(local_380,local_300,5);
          local_86c = (uint)bVar63;
          local_3c0 = local_420._0_4_ + (float)local_400._0_4_;
          fStack_3bc = local_420._4_4_ + (float)local_400._4_4_;
          fStack_3b8 = local_420._8_4_ + fStack_3f8;
          fStack_3b4 = local_420._12_4_ + fStack_3f4;
          fStack_3b0 = local_420._16_4_ + fStack_3f0;
          fStack_3ac = local_420._20_4_ + fStack_3ec;
          fStack_3a8 = local_420._24_4_ + fStack_3e8;
          fStack_3a4 = local_420._28_4_ + fStack_3e4;
          for (bVar63 = (byte)uVar23 & bVar63; auVar103 = local_780, bVar63 != 0;
              bVar63 = ~('\x01' << ((byte)iVar27 & 0x1f)) & bVar63 & (byte)uVar23) {
            auVar160._8_4_ = 0x7f800000;
            auVar160._0_8_ = 0x7f8000007f800000;
            auVar160._12_4_ = 0x7f800000;
            auVar160._16_4_ = 0x7f800000;
            auVar160._20_4_ = 0x7f800000;
            auVar160._24_4_ = 0x7f800000;
            auVar160._28_4_ = 0x7f800000;
            auVar100 = vblendmps_avx512vl(auVar160,local_420);
            auVar138._0_4_ =
                 (uint)(bVar63 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar63 & 1) * 0x7f800000;
            bVar67 = (bool)(bVar63 >> 1 & 1);
            auVar138._4_4_ = (uint)bVar67 * auVar100._4_4_ | (uint)!bVar67 * 0x7f800000;
            bVar67 = (bool)(bVar63 >> 2 & 1);
            auVar138._8_4_ = (uint)bVar67 * auVar100._8_4_ | (uint)!bVar67 * 0x7f800000;
            bVar67 = (bool)(bVar63 >> 3 & 1);
            auVar138._12_4_ = (uint)bVar67 * auVar100._12_4_ | (uint)!bVar67 * 0x7f800000;
            bVar67 = (bool)(bVar63 >> 4 & 1);
            auVar138._16_4_ = (uint)bVar67 * auVar100._16_4_ | (uint)!bVar67 * 0x7f800000;
            bVar67 = (bool)(bVar63 >> 5 & 1);
            auVar138._20_4_ = (uint)bVar67 * auVar100._20_4_ | (uint)!bVar67 * 0x7f800000;
            bVar67 = (bool)(bVar63 >> 6 & 1);
            auVar138._24_4_ = (uint)bVar67 * auVar100._24_4_ | (uint)!bVar67 * 0x7f800000;
            auVar138._28_4_ =
                 (uint)(bVar63 >> 7) * auVar100._28_4_ | (uint)!(bool)(bVar63 >> 7) * 0x7f800000;
            auVar100 = vshufps_avx(auVar138,auVar138,0xb1);
            auVar100 = vminps_avx(auVar138,auVar100);
            auVar101 = vshufpd_avx(auVar100,auVar100,5);
            auVar100 = vminps_avx(auVar100,auVar101);
            auVar101 = vpermpd_avx2(auVar100,0x4e);
            auVar100 = vminps_avx(auVar100,auVar101);
            uVar23 = vcmpps_avx512vl(auVar138,auVar100,0);
            bVar61 = (byte)uVar23 & bVar63;
            bVar64 = bVar63;
            if (bVar61 != 0) {
              bVar64 = bVar61;
            }
            iVar27 = 0;
            for (uVar69 = (uint)bVar64; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x80000000) {
              iVar27 = iVar27 + 1;
            }
            uVar69 = *(uint *)(local_1a0 + (uint)(iVar27 << 2));
            auVar247 = ZEXT464(*(uint *)(local_200 + (uint)(iVar27 << 2)));
            fVar245 = local_868;
            if ((float)local_700._0_4_ < 0.0) {
              local_7a0._0_16_ = ZEXT416(*(uint *)(local_200 + (uint)(iVar27 << 2)));
              local_780[1] = 0;
              local_780[0] = bVar63;
              local_780._2_30_ = auVar103._2_30_;
              auVar244 = ZEXT1664(auVar244._0_16_);
              auVar252 = ZEXT1664(auVar252._0_16_);
              auVar260 = ZEXT1664(auVar260._0_16_);
              auVar265 = ZEXT1664(auVar265._0_16_);
              fVar245 = sqrtf((float)local_700._0_4_);
              bVar63 = local_780[0];
              auVar247 = ZEXT1664(local_7a0._0_16_);
              auVar272 = ZEXT3264(local_860);
              auVar271 = ZEXT3264(local_840);
              auVar103 = vmovdqa64_avx512vl(auVar91);
              auVar270 = ZEXT3264(auVar103);
            }
            auVar237 = ZEXT464(uVar69);
            auVar88 = vminps_avx(local_680._0_16_,local_6c0._0_16_);
            auVar84 = vmaxps_avx(local_680._0_16_,local_6c0._0_16_);
            auVar89 = vminps_avx(local_6a0._0_16_,local_6e0._0_16_);
            auVar85 = vminps_avx(auVar88,auVar89);
            auVar88 = vmaxps_avx(local_6a0._0_16_,local_6e0._0_16_);
            auVar89 = vmaxps_avx(auVar84,auVar88);
            auVar215._8_4_ = 0x7fffffff;
            auVar215._0_8_ = 0x7fffffff7fffffff;
            auVar215._12_4_ = 0x7fffffff;
            auVar84 = vandps_avx(auVar85,auVar215);
            auVar88 = vandps_avx(auVar89,auVar215);
            auVar84 = vmaxps_avx(auVar84,auVar88);
            auVar88 = vmovshdup_avx(auVar84);
            auVar88 = vmaxss_avx(auVar88,auVar84);
            auVar84 = vshufpd_avx(auVar84,auVar84,1);
            auVar84 = vmaxss_avx(auVar84,auVar88);
            local_600._0_4_ = auVar84._0_4_ * 1.9073486e-06;
            local_650 = vshufps_avx(auVar89,auVar89,0xff);
            lVar65 = 5;
            do {
              do {
                auVar84 = auVar237._0_16_;
                bVar67 = lVar65 == 0;
                lVar65 = lVar65 + -1;
                if (bVar67) goto LAB_018d098a;
                local_7a0._0_16_ = auVar247._0_16_;
                uVar171 = auVar247._0_4_;
                auVar151._4_4_ = uVar171;
                auVar151._0_4_ = uVar171;
                auVar151._8_4_ = uVar171;
                auVar151._12_4_ = uVar171;
                auVar88 = vfmadd132ps_fma(auVar151,ZEXT816(0) << 0x40,local_6f0);
                fVar254 = auVar237._0_4_;
                fVar230 = 1.0 - fVar254;
                fVar250 = fVar230 * fVar230 * fVar230;
                fVar248 = fVar254 * fVar254;
                fVar224 = fVar254 * fVar248;
                auVar89 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar250),
                                          ZEXT416((uint)fVar224));
                fVar249 = fVar254 * fVar230;
                auVar2 = vfmadd231ss_fma(ZEXT416((uint)(fVar254 * fVar249 * 6.0)),
                                         ZEXT416((uint)(fVar230 * fVar249)),
                                         SUB6416(ZEXT464(0x41400000),0));
                auVar85 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar224),
                                          ZEXT416((uint)fVar250));
                auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar230 * fVar249 * 6.0)),
                                          SUB6416(ZEXT464(0x41400000),0),
                                          ZEXT416((uint)(fVar254 * fVar249)));
                fVar250 = fVar250 * 0.16666667;
                fVar222 = (auVar89._0_4_ + auVar2._0_4_) * 0.16666667;
                fVar223 = (auVar85._0_4_ + auVar20._0_4_) * 0.16666667;
                fVar224 = fVar224 * 0.16666667;
                auVar193._0_4_ = fVar224 * (float)local_6e0._0_4_;
                auVar193._4_4_ = fVar224 * (float)local_6e0._4_4_;
                auVar193._8_4_ = fVar224 * fStack_6d8;
                auVar193._12_4_ = fVar224 * fStack_6d4;
                auVar226._4_4_ = fVar223;
                auVar226._0_4_ = fVar223;
                auVar226._8_4_ = fVar223;
                auVar226._12_4_ = fVar223;
                auVar89 = vfmadd132ps_fma(auVar226,auVar193,local_6a0._0_16_);
                auVar194._4_4_ = fVar222;
                auVar194._0_4_ = fVar222;
                auVar194._8_4_ = fVar222;
                auVar194._12_4_ = fVar222;
                auVar89 = vfmadd132ps_fma(auVar194,auVar89,local_6c0._0_16_);
                auVar174._4_4_ = fVar250;
                auVar174._0_4_ = fVar250;
                auVar174._8_4_ = fVar250;
                auVar174._12_4_ = fVar250;
                auVar89 = vfmadd132ps_fma(auVar174,auVar89,local_680._0_16_);
                local_560._0_16_ = auVar89;
                auVar89 = vsubps_avx(auVar88,auVar89);
                auVar88 = vdpps_avx(auVar89,auVar89,0x7f);
                local_720._0_16_ = auVar89;
                local_740._0_16_ = auVar88;
                local_780._0_16_ = ZEXT416((uint)fVar230);
                if (auVar88._0_4_ < 0.0) {
                  local_7c0._0_4_ = fVar248;
                  local_7e0._0_4_ = fVar249;
                  auVar244._0_4_ = sqrtf(auVar88._0_4_);
                  auVar244._4_60_ = extraout_var;
                  auVar88 = auVar244._0_16_;
                  fVar249 = (float)local_7e0._0_4_;
                  auVar89 = local_780._0_16_;
                }
                else {
                  auVar88 = vsqrtss_avx(auVar88,auVar88);
                  local_7c0._0_4_ = fVar248;
                  auVar89 = ZEXT416((uint)fVar230);
                }
                local_580._4_4_ = auVar89._0_4_;
                local_580._0_4_ = local_580._4_4_;
                fStack_578 = (float)local_580._4_4_;
                fStack_574 = (float)local_580._4_4_;
                auVar85 = vfnmsub213ss_fma(auVar84,auVar84,ZEXT416((uint)(fVar249 * 4.0)));
                auVar89 = vfmadd231ss_fma(ZEXT416((uint)(fVar249 * 4.0)),auVar89,auVar89);
                fVar248 = (float)local_580._4_4_ * -(float)local_580._4_4_ * 0.5;
                fVar249 = auVar85._0_4_ * 0.5;
                fVar250 = auVar89._0_4_ * 0.5;
                local_7c0._0_4_ = (float)local_7c0._0_4_ * 0.5;
                auVar216._0_4_ = (float)local_7c0._0_4_ * (float)local_6e0._0_4_;
                auVar216._4_4_ = (float)local_7c0._0_4_ * (float)local_6e0._4_4_;
                auVar216._8_4_ = (float)local_7c0._0_4_ * fStack_6d8;
                auVar216._12_4_ = (float)local_7c0._0_4_ * fStack_6d4;
                auVar175._4_4_ = fVar250;
                auVar175._0_4_ = fVar250;
                auVar175._8_4_ = fVar250;
                auVar175._12_4_ = fVar250;
                auVar89 = vfmadd132ps_fma(auVar175,auVar216,local_6a0._0_16_);
                auVar195._4_4_ = fVar249;
                auVar195._0_4_ = fVar249;
                auVar195._8_4_ = fVar249;
                auVar195._12_4_ = fVar249;
                auVar89 = vfmadd132ps_fma(auVar195,auVar89,local_6c0._0_16_);
                auVar262._4_4_ = fVar248;
                auVar262._0_4_ = fVar248;
                auVar262._8_4_ = fVar248;
                auVar262._12_4_ = fVar248;
                _local_7c0 = vfmadd132ps_fma(auVar262,auVar89,local_680._0_16_);
                local_5a0._0_16_ = vdpps_avx(_local_7c0,_local_7c0,0x7f);
                auVar52._12_4_ = 0;
                auVar52._0_12_ = ZEXT812(0);
                fVar248 = local_5a0._0_4_;
                auVar89 = vrsqrt14ss_avx512f(auVar52 << 0x20,ZEXT416((uint)fVar248));
                fVar249 = auVar89._0_4_;
                local_5c0._0_16_ = vrcp14ss_avx512f(auVar52 << 0x20,ZEXT416((uint)fVar248));
                auVar89 = vfnmadd213ss_fma(local_5c0._0_16_,local_5a0._0_16_,ZEXT416(0x40000000));
                local_5e0._0_4_ = auVar89._0_4_;
                local_7e0._0_4_ = auVar88._0_4_;
                if (fVar248 < -fVar248) {
                  auVar260._0_4_ = sqrtf(fVar248);
                  auVar260._4_60_ = extraout_var_00;
                  auVar88 = ZEXT416((uint)local_7e0._0_4_);
                  auVar85 = auVar260._0_16_;
                  auVar89 = _local_7c0;
                }
                else {
                  auVar85 = vsqrtss_avx512f(local_5a0._0_16_,local_5a0._0_16_);
                  auVar89 = _local_7c0;
                }
                fVar248 = fVar249 * 1.5 + fVar248 * -0.5 * fVar249 * fVar249 * fVar249;
                auVar234._0_4_ = auVar89._0_4_ * fVar248;
                auVar234._4_4_ = auVar89._4_4_ * fVar248;
                auVar234._8_4_ = auVar89._8_4_ * fVar248;
                auVar234._12_4_ = auVar89._12_4_ * fVar248;
                auVar2 = vdpps_avx(local_720._0_16_,auVar234,0x7f);
                fVar222 = auVar88._0_4_;
                fVar249 = auVar2._0_4_;
                auVar152._0_4_ = fVar249 * fVar249;
                auVar152._4_4_ = auVar2._4_4_ * auVar2._4_4_;
                auVar152._8_4_ = auVar2._8_4_ * auVar2._8_4_;
                auVar152._12_4_ = auVar2._12_4_ * auVar2._12_4_;
                auVar20 = vsubps_avx(local_740._0_16_,auVar152);
                fVar250 = auVar20._0_4_;
                auVar176._4_12_ = ZEXT812(0) << 0x20;
                auVar176._0_4_ = fVar250;
                auVar80 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar176);
                auVar76 = vmulss_avx512f(auVar80,ZEXT416(0x3fc00000));
                auVar77 = vmulss_avx512f(auVar20,ZEXT416(0xbf000000));
                if (fVar250 < 0.0) {
                  local_640 = fVar248;
                  fStack_63c = fVar248;
                  fStack_638 = fVar248;
                  fStack_634 = fVar248;
                  local_630 = auVar234;
                  local_620 = auVar80;
                  fVar250 = sqrtf(fVar250);
                  auVar77 = ZEXT416(auVar77._0_4_);
                  auVar76 = ZEXT416(auVar76._0_4_);
                  auVar85 = ZEXT416(auVar85._0_4_);
                  auVar88 = ZEXT416((uint)local_7e0._0_4_);
                  auVar234 = local_630;
                  auVar89 = _local_7c0;
                  auVar80 = local_620;
                  fVar248 = local_640;
                  fVar223 = fStack_63c;
                  fVar224 = fStack_638;
                  fVar230 = fStack_634;
                }
                else {
                  auVar20 = vsqrtss_avx(auVar20,auVar20);
                  fVar250 = auVar20._0_4_;
                  fVar223 = fVar248;
                  fVar224 = fVar248;
                  fVar230 = fVar248;
                }
                auVar265 = ZEXT1664(auVar89);
                auVar260 = ZEXT1664(local_740._0_16_);
                auVar252 = ZEXT1664(local_720._0_16_);
                auVar103 = vmovdqa64_avx512vl(auVar91);
                auVar270 = ZEXT3264(auVar103);
                auVar271 = ZEXT3264(local_840);
                auVar272 = ZEXT3264(local_860);
                auVar20 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_780._0_16_,auVar84);
                auVar84 = vfmadd231ss_fma(local_780._0_16_,auVar84,SUB6416(ZEXT464(0xc0000000),0));
                auVar196._0_4_ = fVar254 * (float)local_6e0._0_4_;
                auVar196._4_4_ = fVar254 * (float)local_6e0._4_4_;
                auVar196._8_4_ = fVar254 * fStack_6d8;
                auVar196._12_4_ = fVar254 * fStack_6d4;
                auVar217._0_4_ = auVar84._0_4_;
                auVar217._4_4_ = auVar217._0_4_;
                auVar217._8_4_ = auVar217._0_4_;
                auVar217._12_4_ = auVar217._0_4_;
                auVar84 = vfmadd132ps_fma(auVar217,auVar196,local_6a0._0_16_);
                auVar177._0_4_ = auVar20._0_4_;
                auVar177._4_4_ = auVar177._0_4_;
                auVar177._8_4_ = auVar177._0_4_;
                auVar177._12_4_ = auVar177._0_4_;
                auVar84 = vfmadd132ps_fma(auVar177,auVar84,local_6c0._0_16_);
                auVar84 = vfmadd132ps_fma(_local_580,auVar84,local_680._0_16_);
                auVar178._0_4_ = auVar84._0_4_ * (float)local_5a0._0_4_;
                auVar178._4_4_ = auVar84._4_4_ * (float)local_5a0._0_4_;
                auVar178._8_4_ = auVar84._8_4_ * (float)local_5a0._0_4_;
                auVar178._12_4_ = auVar84._12_4_ * (float)local_5a0._0_4_;
                auVar84 = vdpps_avx(auVar89,auVar84,0x7f);
                fVar190 = auVar84._0_4_;
                auVar197._0_4_ = auVar89._0_4_ * fVar190;
                auVar197._4_4_ = auVar89._4_4_ * fVar190;
                auVar197._8_4_ = auVar89._8_4_ * fVar190;
                auVar197._12_4_ = auVar89._12_4_ * fVar190;
                auVar84 = vsubps_avx(auVar178,auVar197);
                fVar190 = (float)local_5e0._0_4_ * (float)local_5c0._0_4_;
                auVar28._8_4_ = 0x80000000;
                auVar28._0_8_ = 0x8000000080000000;
                auVar28._12_4_ = 0x80000000;
                auVar79 = vxorps_avx512vl(auVar89,auVar28);
                auVar227._0_4_ = fVar248 * auVar84._0_4_ * fVar190;
                auVar227._4_4_ = fVar223 * auVar84._4_4_ * fVar190;
                auVar227._8_4_ = fVar224 * auVar84._8_4_ * fVar190;
                auVar227._12_4_ = fVar230 * auVar84._12_4_ * fVar190;
                auVar84 = vdpps_avx(auVar79,auVar234,0x7f);
                auVar20 = vmaxss_avx(ZEXT416((uint)local_600._0_4_),
                                     ZEXT416((uint)((float)local_7a0._0_4_ * fVar245 * 1.9073486e-06
                                                   )));
                auVar78 = vdivss_avx512f(ZEXT416((uint)local_600._0_4_),auVar85);
                auVar85 = vdpps_avx(local_720._0_16_,auVar227,0x7f);
                auVar88 = vfmadd213ss_fma(auVar88,ZEXT416((uint)local_600._0_4_),auVar20);
                auVar78 = vfmadd213ss_fma(ZEXT416((uint)(fVar222 + 1.0)),auVar78,auVar88);
                auVar88 = vdpps_avx(local_6f0,auVar234,0x7f);
                fVar248 = auVar84._0_4_ + auVar85._0_4_;
                auVar84 = vdpps_avx(local_720._0_16_,auVar79,0x7f);
                auVar77 = vmulss_avx512f(auVar77,auVar80);
                auVar80 = vmulss_avx512f(auVar80,auVar80);
                auVar85 = vdpps_avx(local_720._0_16_,local_6f0,0x7f);
                auVar77 = vaddss_avx512f(auVar76,ZEXT416((uint)(auVar77._0_4_ * auVar80._0_4_)));
                auVar80 = vfnmadd231ss_fma(auVar84,auVar2,ZEXT416((uint)fVar248));
                auVar76 = vfnmadd231ss_fma(auVar85,auVar2,auVar88);
                auVar84 = vpermilps_avx(local_560._0_16_,0xff);
                fVar250 = fVar250 - auVar84._0_4_;
                auVar84 = vshufps_avx(auVar89,auVar89,0xff);
                auVar85 = vfmsub213ss_fma(auVar80,auVar77,auVar84);
                fVar222 = auVar76._0_4_ * auVar77._0_4_;
                auVar80 = vfmsub231ss_fma(ZEXT416((uint)(auVar88._0_4_ * auVar85._0_4_)),
                                          ZEXT416((uint)fVar248),ZEXT416((uint)fVar222));
                auVar244 = ZEXT1664(auVar80);
                fVar223 = auVar80._0_4_;
                fVar254 = fVar254 - (fVar249 * (fVar222 / fVar223) -
                                    fVar250 * (auVar88._0_4_ / fVar223));
                auVar237 = ZEXT464((uint)fVar254);
                fVar248 = (float)local_7a0._0_4_ -
                          (fVar250 * (fVar248 / fVar223) - fVar249 * (auVar85._0_4_ / fVar223));
                auVar247 = ZEXT464((uint)fVar248);
                auVar29._8_4_ = 0x7fffffff;
                auVar29._0_8_ = 0x7fffffff7fffffff;
                auVar29._12_4_ = 0x7fffffff;
                auVar88 = vandps_avx512vl(auVar2,auVar29);
              } while (auVar78._0_4_ <= auVar88._0_4_);
              auVar88 = vfmadd231ss_fma(ZEXT416((uint)(auVar78._0_4_ + auVar20._0_4_)),local_650,
                                        ZEXT416(0x36000000));
              auVar30._8_4_ = 0x7fffffff;
              auVar30._0_8_ = 0x7fffffff7fffffff;
              auVar30._12_4_ = 0x7fffffff;
              auVar85 = vandps_avx512vl(ZEXT416((uint)fVar250),auVar30);
            } while (auVar88._0_4_ <= auVar85._0_4_);
            fVar245 = fVar248 + (float)local_660._0_4_;
            if ((((fVar18 <= fVar245) &&
                 (fVar249 = *(float *)(ray + k * 4 + 0x80), fVar245 <= fVar249)) && (0.0 <= fVar254)
                ) && (fVar254 <= 1.0)) {
              auVar198._4_12_ = SUB1612(ZEXT816(0),0);
              auVar198._0_4_ = local_740._0_4_;
              auVar88 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar198);
              fVar250 = auVar88._0_4_;
              pGVar5 = (context->scene->geometries).items[uVar3].ptr;
              if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                fVar250 = fVar250 * 1.5 + local_740._0_4_ * -0.5 * fVar250 * fVar250 * fVar250;
                auVar199._0_4_ = local_720._0_4_ * fVar250;
                auVar199._4_4_ = local_720._4_4_ * fVar250;
                auVar199._8_4_ = local_720._8_4_ * fVar250;
                auVar199._12_4_ = local_720._12_4_ * fVar250;
                auVar2 = vfmadd213ps_fma(auVar84,auVar199,auVar89);
                auVar84 = vshufps_avx(auVar199,auVar199,0xc9);
                auVar88 = vshufps_avx(auVar89,auVar89,0xc9);
                auVar200._0_4_ = auVar199._0_4_ * auVar88._0_4_;
                auVar200._4_4_ = auVar199._4_4_ * auVar88._4_4_;
                auVar200._8_4_ = auVar199._8_4_ * auVar88._8_4_;
                auVar200._12_4_ = auVar199._12_4_ * auVar88._12_4_;
                auVar85 = vfmsub231ps_fma(auVar200,auVar89,auVar84);
                auVar84 = vshufps_avx(auVar85,auVar85,0xc9);
                auVar88 = vshufps_avx(auVar2,auVar2,0xc9);
                auVar85 = vshufps_avx(auVar85,auVar85,0xd2);
                auVar153._0_4_ = auVar2._0_4_ * auVar85._0_4_;
                auVar153._4_4_ = auVar2._4_4_ * auVar85._4_4_;
                auVar153._8_4_ = auVar2._8_4_ * auVar85._8_4_;
                auVar153._12_4_ = auVar2._12_4_ * auVar85._12_4_;
                auVar84 = vfmsub231ps_fma(auVar153,auVar84,auVar88);
                uVar171 = auVar84._0_4_;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  *(float *)(ray + k * 4 + 0x80) = fVar245;
                  uVar4 = vextractps_avx(auVar84,1);
                  *(undefined4 *)(ray + k * 4 + 0xc0) = uVar4;
                  uVar4 = vextractps_avx(auVar84,2);
                  *(undefined4 *)(ray + k * 4 + 0xd0) = uVar4;
                  *(undefined4 *)(ray + k * 4 + 0xe0) = uVar171;
                  *(float *)(ray + k * 4 + 0xf0) = fVar254;
                  *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                  *(int *)(ray + k * 4 + 0x110) = (int)local_748;
                  *(uint *)(ray + k * 4 + 0x120) = uVar3;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                }
                else {
                  local_500 = (RTCHitN  [16])vshufps_avx(auVar84,auVar84,0x55);
                  auStack_4f0 = vshufps_avx(auVar84,auVar84,0xaa);
                  local_4e0 = uVar171;
                  uStack_4dc = uVar171;
                  uStack_4d8 = uVar171;
                  uStack_4d4 = uVar171;
                  local_4d0 = fVar254;
                  fStack_4cc = fVar254;
                  fStack_4c8 = fVar254;
                  fStack_4c4 = fVar254;
                  local_4c0 = ZEXT416(0) << 0x20;
                  local_4b0 = local_520._0_8_;
                  uStack_4a8 = local_520._8_8_;
                  local_4a0 = local_510;
                  vpcmpeqd_avx2(ZEXT1632(local_510),ZEXT1632(local_510));
                  uStack_48c = context->user->instID[0];
                  local_490 = uStack_48c;
                  uStack_488 = uStack_48c;
                  uStack_484 = uStack_48c;
                  uStack_480 = context->user->instPrimID[0];
                  uStack_47c = uStack_480;
                  uStack_478 = uStack_480;
                  uStack_474 = uStack_480;
                  *(float *)(ray + k * 4 + 0x80) = fVar245;
                  local_890 = local_530;
                  local_810.valid = (int *)local_890;
                  local_810.geometryUserPtr = pGVar5->userPtr;
                  local_810.context = context->user;
                  local_810.hit = local_500;
                  local_810.N = 4;
                  local_810.ray = (RTCRayN *)ray;
                  if (pGVar5->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar244 = ZEXT1664(auVar80);
                    auVar247 = ZEXT464((uint)fVar248);
                    auVar252 = ZEXT1664(local_720._0_16_);
                    auVar260 = ZEXT1664(local_740._0_16_);
                    auVar265 = ZEXT1664(auVar89);
                    (*pGVar5->intersectionFilterN)(&local_810);
                    auVar272 = ZEXT3264(local_860);
                    auVar271 = ZEXT3264(local_840);
                    auVar103 = vmovdqa64_avx512vl(auVar91);
                    auVar270 = ZEXT3264(auVar103);
                  }
                  uVar68 = vptestmd_avx512vl(local_890,local_890);
                  if ((uVar68 & 0xf) != 0) {
                    p_Var9 = context->args->filter;
                    if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar244 = ZEXT1664(auVar244._0_16_);
                      auVar247 = ZEXT1664(auVar247._0_16_);
                      auVar252 = ZEXT1664(auVar252._0_16_);
                      auVar260 = ZEXT1664(auVar260._0_16_);
                      auVar265 = ZEXT1664(auVar265._0_16_);
                      (*p_Var9)(&local_810);
                      auVar272 = ZEXT3264(local_860);
                      auVar271 = ZEXT3264(local_840);
                      auVar103 = vmovdqa64_avx512vl(auVar91);
                      auVar270 = ZEXT3264(auVar103);
                    }
                    uVar68 = vptestmd_avx512vl(local_890,local_890);
                    uVar68 = uVar68 & 0xf;
                    bVar64 = (byte)uVar68;
                    if (bVar64 != 0) {
                      iVar54 = *(int *)(local_810.hit + 4);
                      iVar55 = *(int *)(local_810.hit + 8);
                      iVar56 = *(int *)(local_810.hit + 0xc);
                      bVar67 = (bool)((byte)(uVar68 >> 1) & 1);
                      bVar10 = (bool)((byte)(uVar68 >> 2) & 1);
                      bVar11 = SUB81(uVar68 >> 3,0);
                      *(uint *)(local_810.ray + 0xc0) =
                           (uint)(bVar64 & 1) * *(int *)local_810.hit |
                           (uint)!(bool)(bVar64 & 1) * *(int *)(local_810.ray + 0xc0);
                      *(uint *)(local_810.ray + 0xc4) =
                           (uint)bVar67 * iVar54 | (uint)!bVar67 * *(int *)(local_810.ray + 0xc4);
                      *(uint *)(local_810.ray + 200) =
                           (uint)bVar10 * iVar55 | (uint)!bVar10 * *(int *)(local_810.ray + 200);
                      *(uint *)(local_810.ray + 0xcc) =
                           (uint)bVar11 * iVar56 | (uint)!bVar11 * *(int *)(local_810.ray + 0xcc);
                      iVar54 = *(int *)(local_810.hit + 0x14);
                      iVar55 = *(int *)(local_810.hit + 0x18);
                      iVar56 = *(int *)(local_810.hit + 0x1c);
                      bVar67 = (bool)((byte)(uVar68 >> 1) & 1);
                      bVar10 = (bool)((byte)(uVar68 >> 2) & 1);
                      bVar11 = SUB81(uVar68 >> 3,0);
                      *(uint *)(local_810.ray + 0xd0) =
                           (uint)(bVar64 & 1) * *(int *)(local_810.hit + 0x10) |
                           (uint)!(bool)(bVar64 & 1) * *(int *)(local_810.ray + 0xd0);
                      *(uint *)(local_810.ray + 0xd4) =
                           (uint)bVar67 * iVar54 | (uint)!bVar67 * *(int *)(local_810.ray + 0xd4);
                      *(uint *)(local_810.ray + 0xd8) =
                           (uint)bVar10 * iVar55 | (uint)!bVar10 * *(int *)(local_810.ray + 0xd8);
                      *(uint *)(local_810.ray + 0xdc) =
                           (uint)bVar11 * iVar56 | (uint)!bVar11 * *(int *)(local_810.ray + 0xdc);
                      iVar54 = *(int *)(local_810.hit + 0x24);
                      iVar55 = *(int *)(local_810.hit + 0x28);
                      iVar56 = *(int *)(local_810.hit + 0x2c);
                      bVar67 = (bool)((byte)(uVar68 >> 1) & 1);
                      bVar10 = (bool)((byte)(uVar68 >> 2) & 1);
                      bVar11 = SUB81(uVar68 >> 3,0);
                      *(uint *)(local_810.ray + 0xe0) =
                           (uint)(bVar64 & 1) * *(int *)(local_810.hit + 0x20) |
                           (uint)!(bool)(bVar64 & 1) * *(int *)(local_810.ray + 0xe0);
                      *(uint *)(local_810.ray + 0xe4) =
                           (uint)bVar67 * iVar54 | (uint)!bVar67 * *(int *)(local_810.ray + 0xe4);
                      *(uint *)(local_810.ray + 0xe8) =
                           (uint)bVar10 * iVar55 | (uint)!bVar10 * *(int *)(local_810.ray + 0xe8);
                      *(uint *)(local_810.ray + 0xec) =
                           (uint)bVar11 * iVar56 | (uint)!bVar11 * *(int *)(local_810.ray + 0xec);
                      iVar54 = *(int *)(local_810.hit + 0x34);
                      iVar55 = *(int *)(local_810.hit + 0x38);
                      iVar56 = *(int *)(local_810.hit + 0x3c);
                      bVar67 = (bool)((byte)(uVar68 >> 1) & 1);
                      bVar10 = (bool)((byte)(uVar68 >> 2) & 1);
                      bVar11 = SUB81(uVar68 >> 3,0);
                      *(uint *)(local_810.ray + 0xf0) =
                           (uint)(bVar64 & 1) * *(int *)(local_810.hit + 0x30) |
                           (uint)!(bool)(bVar64 & 1) * *(int *)(local_810.ray + 0xf0);
                      *(uint *)(local_810.ray + 0xf4) =
                           (uint)bVar67 * iVar54 | (uint)!bVar67 * *(int *)(local_810.ray + 0xf4);
                      *(uint *)(local_810.ray + 0xf8) =
                           (uint)bVar10 * iVar55 | (uint)!bVar10 * *(int *)(local_810.ray + 0xf8);
                      *(uint *)(local_810.ray + 0xfc) =
                           (uint)bVar11 * iVar56 | (uint)!bVar11 * *(int *)(local_810.ray + 0xfc);
                      iVar54 = *(int *)(local_810.hit + 0x44);
                      iVar55 = *(int *)(local_810.hit + 0x48);
                      iVar56 = *(int *)(local_810.hit + 0x4c);
                      bVar67 = (bool)((byte)(uVar68 >> 1) & 1);
                      bVar10 = (bool)((byte)(uVar68 >> 2) & 1);
                      bVar11 = SUB81(uVar68 >> 3,0);
                      *(uint *)(local_810.ray + 0x100) =
                           (uint)(bVar64 & 1) * *(int *)(local_810.hit + 0x40) |
                           (uint)!(bool)(bVar64 & 1) * *(int *)(local_810.ray + 0x100);
                      *(uint *)(local_810.ray + 0x104) =
                           (uint)bVar67 * iVar54 | (uint)!bVar67 * *(int *)(local_810.ray + 0x104);
                      *(uint *)(local_810.ray + 0x108) =
                           (uint)bVar10 * iVar55 | (uint)!bVar10 * *(int *)(local_810.ray + 0x108);
                      *(uint *)(local_810.ray + 0x10c) =
                           (uint)bVar11 * iVar56 | (uint)!bVar11 * *(int *)(local_810.ray + 0x10c);
                      auVar84 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_810.hit + 0x50));
                      *(undefined1 (*) [16])(local_810.ray + 0x110) = auVar84;
                      auVar84 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_810.hit + 0x60));
                      *(undefined1 (*) [16])(local_810.ray + 0x120) = auVar84;
                      auVar84 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_810.hit + 0x70));
                      *(undefined1 (*) [16])(local_810.ray + 0x130) = auVar84;
                      auVar84 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_810.hit + 0x80));
                      *(undefined1 (*) [16])(local_810.ray + 0x140) = auVar84;
                      goto LAB_018d098a;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x80) = fVar249;
                }
              }
            }
LAB_018d098a:
            uVar171 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar235._4_4_ = uVar171;
            auVar235._0_4_ = uVar171;
            auVar235._8_4_ = uVar171;
            auVar235._12_4_ = uVar171;
            auVar235._16_4_ = uVar171;
            auVar235._20_4_ = uVar171;
            auVar235._24_4_ = uVar171;
            auVar235._28_4_ = uVar171;
            auVar237 = ZEXT3264(auVar235);
            auVar57._4_4_ = fStack_3bc;
            auVar57._0_4_ = local_3c0;
            auVar57._8_4_ = fStack_3b8;
            auVar57._12_4_ = fStack_3b4;
            auVar57._16_4_ = fStack_3b0;
            auVar57._20_4_ = fStack_3ac;
            auVar57._24_4_ = fStack_3a8;
            auVar57._28_4_ = fStack_3a4;
            uVar23 = vcmpps_avx512vl(auVar235,auVar57,0xd);
          }
          auVar161._0_4_ = (float)local_400._0_4_ + (float)local_3e0._0_4_;
          auVar161._4_4_ = (float)local_400._4_4_ + (float)local_3e0._4_4_;
          auVar161._8_4_ = fStack_3f8 + fStack_3d8;
          auVar161._12_4_ = fStack_3f4 + fStack_3d4;
          auVar161._16_4_ = fStack_3f0 + fStack_3d0;
          auVar161._20_4_ = fStack_3ec + fStack_3cc;
          auVar161._24_4_ = fStack_3e8 + fStack_3c8;
          auVar161._28_4_ = fStack_3e4 + fStack_3c4;
          uVar171 = auVar237._0_4_;
          auVar185._4_4_ = uVar171;
          auVar185._0_4_ = uVar171;
          auVar185._8_4_ = uVar171;
          auVar185._12_4_ = uVar171;
          auVar185._16_4_ = uVar171;
          auVar185._20_4_ = uVar171;
          auVar185._24_4_ = uVar171;
          auVar185._28_4_ = uVar171;
          uVar23 = vcmpps_avx512vl(auVar161,auVar185,2);
          auVar162._8_4_ = 2;
          auVar162._0_8_ = 0x200000002;
          auVar162._12_4_ = 2;
          auVar162._16_4_ = 2;
          auVar162._20_4_ = 2;
          auVar162._24_4_ = 2;
          auVar162._28_4_ = 2;
          auVar37._8_4_ = 3;
          auVar37._0_8_ = 0x300000003;
          auVar37._12_4_ = 3;
          auVar37._16_4_ = 3;
          auVar37._20_4_ = 3;
          auVar37._24_4_ = 3;
          auVar37._28_4_ = 3;
          auVar103 = vpblendmd_avx512vl(auVar162,auVar37);
          bVar67 = (bool)((byte)local_870 & 1);
          local_3e0._0_4_ = (uint)bVar67 * auVar103._0_4_ | (uint)!bVar67 * 2;
          bVar67 = (bool)((byte)(local_870 >> 1) & 1);
          local_3e0._4_4_ = (uint)bVar67 * auVar103._4_4_ | (uint)!bVar67 * 2;
          bVar67 = (bool)((byte)(local_870 >> 2) & 1);
          fStack_3d8 = (float)((uint)bVar67 * auVar103._8_4_ | (uint)!bVar67 * 2);
          bVar67 = (bool)((byte)(local_870 >> 3) & 1);
          fStack_3d4 = (float)((uint)bVar67 * auVar103._12_4_ | (uint)!bVar67 * 2);
          bVar67 = (bool)((byte)(local_870 >> 4) & 1);
          fStack_3d0 = (float)((uint)bVar67 * auVar103._16_4_ | (uint)!bVar67 * 2);
          bVar67 = (bool)((byte)(local_870 >> 5) & 1);
          fStack_3cc = (float)((uint)bVar67 * auVar103._20_4_ | (uint)!bVar67 * 2);
          bVar67 = (bool)((byte)(local_870 >> 6) & 1);
          fStack_3c8 = (float)((uint)bVar67 * auVar103._24_4_ | (uint)!bVar67 * 2);
          bVar67 = (bool)((byte)(local_870 >> 7) & 1);
          fStack_3c4 = (float)((uint)bVar67 * auVar103._28_4_ | (uint)!bVar67 * 2);
          bVar60 = (byte)uVar25 & bVar60 & (byte)uVar23;
          uVar23 = vpcmpd_avx512vl(_local_3e0,local_380,2);
          local_420 = _local_340;
          local_3c0 = (float)local_400._0_4_ + (float)local_340._0_4_;
          fStack_3bc = (float)local_400._4_4_ + (float)local_340._4_4_;
          fStack_3b8 = fStack_3f8 + fStack_338;
          fStack_3b4 = fStack_3f4 + fStack_334;
          fStack_3b0 = fStack_3f0 + fStack_330;
          fStack_3ac = fStack_3ec + fStack_32c;
          fStack_3a8 = fStack_3e8 + fStack_328;
          fStack_3a4 = fStack_3e4 + fStack_324;
          for (bVar64 = (byte)uVar23 & bVar60; auVar103 = local_780, bVar64 != 0;
              bVar64 = ~('\x01' << ((byte)iVar27 & 0x1f)) & bVar64 & (byte)uVar23) {
            auVar163._8_4_ = 0x7f800000;
            auVar163._0_8_ = 0x7f8000007f800000;
            auVar163._12_4_ = 0x7f800000;
            auVar163._16_4_ = 0x7f800000;
            auVar163._20_4_ = 0x7f800000;
            auVar163._24_4_ = 0x7f800000;
            auVar163._28_4_ = 0x7f800000;
            auVar100 = vblendmps_avx512vl(auVar163,local_420);
            auVar139._0_4_ =
                 (uint)(bVar64 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar64 & 1) * 0x7f800000;
            bVar67 = (bool)(bVar64 >> 1 & 1);
            auVar139._4_4_ = (uint)bVar67 * auVar100._4_4_ | (uint)!bVar67 * 0x7f800000;
            bVar67 = (bool)(bVar64 >> 2 & 1);
            auVar139._8_4_ = (uint)bVar67 * auVar100._8_4_ | (uint)!bVar67 * 0x7f800000;
            bVar67 = (bool)(bVar64 >> 3 & 1);
            auVar139._12_4_ = (uint)bVar67 * auVar100._12_4_ | (uint)!bVar67 * 0x7f800000;
            bVar67 = (bool)(bVar64 >> 4 & 1);
            auVar139._16_4_ = (uint)bVar67 * auVar100._16_4_ | (uint)!bVar67 * 0x7f800000;
            bVar67 = (bool)(bVar64 >> 5 & 1);
            auVar139._20_4_ = (uint)bVar67 * auVar100._20_4_ | (uint)!bVar67 * 0x7f800000;
            bVar67 = (bool)(bVar64 >> 6 & 1);
            auVar139._24_4_ = (uint)bVar67 * auVar100._24_4_ | (uint)!bVar67 * 0x7f800000;
            auVar139._28_4_ =
                 (uint)(bVar64 >> 7) * auVar100._28_4_ | (uint)!(bool)(bVar64 >> 7) * 0x7f800000;
            auVar100 = vshufps_avx(auVar139,auVar139,0xb1);
            auVar100 = vminps_avx(auVar139,auVar100);
            auVar101 = vshufpd_avx(auVar100,auVar100,5);
            auVar100 = vminps_avx(auVar100,auVar101);
            auVar101 = vpermpd_avx2(auVar100,0x4e);
            auVar100 = vminps_avx(auVar100,auVar101);
            uVar23 = vcmpps_avx512vl(auVar139,auVar100,0);
            bVar61 = (byte)uVar23 & bVar64;
            bVar63 = bVar64;
            if (bVar61 != 0) {
              bVar63 = bVar61;
            }
            iVar27 = 0;
            for (uVar69 = (uint)bVar63; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x80000000) {
              iVar27 = iVar27 + 1;
            }
            uVar69 = *(uint *)(local_1c0 + (uint)(iVar27 << 2));
            auVar247 = ZEXT464(*(uint *)(local_320 + (uint)(iVar27 << 2)));
            fVar245 = local_864;
            if ((float)local_700._0_4_ < 0.0) {
              local_7a0._0_16_ = ZEXT416(*(uint *)(local_320 + (uint)(iVar27 << 2)));
              local_780[1] = 0;
              local_780[0] = bVar64;
              local_780._2_30_ = auVar103._2_30_;
              auVar244 = ZEXT1664(auVar244._0_16_);
              auVar252 = ZEXT1664(auVar252._0_16_);
              auVar260 = ZEXT1664(auVar260._0_16_);
              auVar265 = ZEXT1664(auVar265._0_16_);
              fVar245 = sqrtf((float)local_700._0_4_);
              bVar64 = local_780[0];
              auVar247 = ZEXT1664(local_7a0._0_16_);
              auVar272 = ZEXT3264(local_860);
              auVar271 = ZEXT3264(local_840);
              auVar103 = vmovdqa64_avx512vl(auVar91);
              auVar270 = ZEXT3264(auVar103);
            }
            auVar237 = ZEXT464(uVar69);
            auVar88 = vminps_avx(local_680._0_16_,local_6c0._0_16_);
            auVar84 = vmaxps_avx(local_680._0_16_,local_6c0._0_16_);
            auVar89 = vminps_avx(local_6a0._0_16_,local_6e0._0_16_);
            auVar85 = vminps_avx(auVar88,auVar89);
            auVar88 = vmaxps_avx(local_6a0._0_16_,local_6e0._0_16_);
            auVar89 = vmaxps_avx(auVar84,auVar88);
            auVar218._8_4_ = 0x7fffffff;
            auVar218._0_8_ = 0x7fffffff7fffffff;
            auVar218._12_4_ = 0x7fffffff;
            auVar84 = vandps_avx(auVar85,auVar218);
            auVar88 = vandps_avx(auVar89,auVar218);
            auVar84 = vmaxps_avx(auVar84,auVar88);
            auVar88 = vmovshdup_avx(auVar84);
            auVar88 = vmaxss_avx(auVar88,auVar84);
            auVar84 = vshufpd_avx(auVar84,auVar84,1);
            auVar84 = vmaxss_avx(auVar84,auVar88);
            local_600._0_4_ = auVar84._0_4_ * 1.9073486e-06;
            local_650 = vshufps_avx(auVar89,auVar89,0xff);
            lVar65 = 5;
            do {
              do {
                auVar84 = auVar237._0_16_;
                bVar67 = lVar65 == 0;
                lVar65 = lVar65 + -1;
                if (bVar67) goto LAB_018d165a;
                local_7a0._0_16_ = auVar247._0_16_;
                uVar171 = auVar247._0_4_;
                auVar154._4_4_ = uVar171;
                auVar154._0_4_ = uVar171;
                auVar154._8_4_ = uVar171;
                auVar154._12_4_ = uVar171;
                auVar88 = vfmadd132ps_fma(auVar154,ZEXT816(0) << 0x40,local_6f0);
                fVar254 = auVar237._0_4_;
                fVar230 = 1.0 - fVar254;
                fVar250 = fVar230 * fVar230 * fVar230;
                fVar248 = fVar254 * fVar254;
                fVar224 = fVar254 * fVar248;
                auVar89 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar250),
                                          ZEXT416((uint)fVar224));
                fVar249 = fVar254 * fVar230;
                auVar2 = vfmadd231ss_fma(ZEXT416((uint)(fVar254 * fVar249 * 6.0)),
                                         ZEXT416((uint)(fVar230 * fVar249)),
                                         SUB6416(ZEXT464(0x41400000),0));
                auVar85 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar224),
                                          ZEXT416((uint)fVar250));
                auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar230 * fVar249 * 6.0)),
                                          SUB6416(ZEXT464(0x41400000),0),
                                          ZEXT416((uint)(fVar254 * fVar249)));
                fVar250 = fVar250 * 0.16666667;
                fVar222 = (auVar89._0_4_ + auVar2._0_4_) * 0.16666667;
                fVar223 = (auVar85._0_4_ + auVar20._0_4_) * 0.16666667;
                fVar224 = fVar224 * 0.16666667;
                auVar201._0_4_ = fVar224 * (float)local_6e0._0_4_;
                auVar201._4_4_ = fVar224 * (float)local_6e0._4_4_;
                auVar201._8_4_ = fVar224 * fStack_6d8;
                auVar201._12_4_ = fVar224 * fStack_6d4;
                auVar228._4_4_ = fVar223;
                auVar228._0_4_ = fVar223;
                auVar228._8_4_ = fVar223;
                auVar228._12_4_ = fVar223;
                auVar89 = vfmadd132ps_fma(auVar228,auVar201,local_6a0._0_16_);
                auVar202._4_4_ = fVar222;
                auVar202._0_4_ = fVar222;
                auVar202._8_4_ = fVar222;
                auVar202._12_4_ = fVar222;
                auVar89 = vfmadd132ps_fma(auVar202,auVar89,local_6c0._0_16_);
                auVar179._4_4_ = fVar250;
                auVar179._0_4_ = fVar250;
                auVar179._8_4_ = fVar250;
                auVar179._12_4_ = fVar250;
                auVar89 = vfmadd132ps_fma(auVar179,auVar89,local_680._0_16_);
                local_560._0_16_ = auVar89;
                auVar89 = vsubps_avx(auVar88,auVar89);
                auVar88 = vdpps_avx(auVar89,auVar89,0x7f);
                local_720._0_16_ = auVar89;
                local_740._0_16_ = auVar88;
                local_780._0_16_ = ZEXT416((uint)fVar230);
                if (auVar88._0_4_ < 0.0) {
                  local_7c0._0_4_ = fVar248;
                  local_7e0._0_4_ = fVar249;
                  auVar252._0_4_ = sqrtf(auVar88._0_4_);
                  auVar252._4_60_ = extraout_var_01;
                  auVar88 = auVar252._0_16_;
                  fVar249 = (float)local_7e0._0_4_;
                  auVar89 = local_780._0_16_;
                }
                else {
                  auVar88 = vsqrtss_avx(auVar88,auVar88);
                  local_7c0._0_4_ = fVar248;
                  auVar89 = ZEXT416((uint)fVar230);
                }
                local_580._4_4_ = auVar89._0_4_;
                local_580._0_4_ = local_580._4_4_;
                fStack_578 = (float)local_580._4_4_;
                fStack_574 = (float)local_580._4_4_;
                auVar85 = vfnmsub213ss_fma(auVar84,auVar84,ZEXT416((uint)(fVar249 * 4.0)));
                auVar89 = vfmadd231ss_fma(ZEXT416((uint)(fVar249 * 4.0)),auVar89,auVar89);
                fVar248 = (float)local_580._4_4_ * -(float)local_580._4_4_ * 0.5;
                fVar249 = auVar85._0_4_ * 0.5;
                fVar250 = auVar89._0_4_ * 0.5;
                local_7c0._0_4_ = (float)local_7c0._0_4_ * 0.5;
                auVar219._0_4_ = (float)local_7c0._0_4_ * (float)local_6e0._0_4_;
                auVar219._4_4_ = (float)local_7c0._0_4_ * (float)local_6e0._4_4_;
                auVar219._8_4_ = (float)local_7c0._0_4_ * fStack_6d8;
                auVar219._12_4_ = (float)local_7c0._0_4_ * fStack_6d4;
                auVar180._4_4_ = fVar250;
                auVar180._0_4_ = fVar250;
                auVar180._8_4_ = fVar250;
                auVar180._12_4_ = fVar250;
                auVar89 = vfmadd132ps_fma(auVar180,auVar219,local_6a0._0_16_);
                auVar203._4_4_ = fVar249;
                auVar203._0_4_ = fVar249;
                auVar203._8_4_ = fVar249;
                auVar203._12_4_ = fVar249;
                auVar89 = vfmadd132ps_fma(auVar203,auVar89,local_6c0._0_16_);
                auVar263._4_4_ = fVar248;
                auVar263._0_4_ = fVar248;
                auVar263._8_4_ = fVar248;
                auVar263._12_4_ = fVar248;
                _local_7c0 = vfmadd132ps_fma(auVar263,auVar89,local_680._0_16_);
                local_5a0._0_16_ = vdpps_avx(_local_7c0,_local_7c0,0x7f);
                auVar53._12_4_ = 0;
                auVar53._0_12_ = ZEXT812(0);
                fVar248 = local_5a0._0_4_;
                auVar89 = vrsqrt14ss_avx512f(auVar53 << 0x20,ZEXT416((uint)fVar248));
                fVar249 = auVar89._0_4_;
                local_5c0._0_16_ = vrcp14ss_avx512f(auVar53 << 0x20,ZEXT416((uint)fVar248));
                auVar89 = vfnmadd213ss_fma(local_5c0._0_16_,local_5a0._0_16_,ZEXT416(0x40000000));
                local_5e0._0_4_ = auVar89._0_4_;
                local_7e0._0_4_ = auVar88._0_4_;
                if (fVar248 < -fVar248) {
                  auVar237._0_4_ = sqrtf(fVar248);
                  auVar237._4_60_ = extraout_var_02;
                  auVar88 = ZEXT416((uint)local_7e0._0_4_);
                  auVar85 = auVar237._0_16_;
                  auVar89 = _local_7c0;
                }
                else {
                  auVar85 = vsqrtss_avx512f(local_5a0._0_16_,local_5a0._0_16_);
                  auVar89 = _local_7c0;
                }
                fVar248 = fVar249 * 1.5 + fVar248 * -0.5 * fVar249 * fVar249 * fVar249;
                auVar269._0_4_ = auVar89._0_4_ * fVar248;
                auVar269._4_4_ = auVar89._4_4_ * fVar248;
                auVar269._8_4_ = auVar89._8_4_ * fVar248;
                auVar269._12_4_ = auVar89._12_4_ * fVar248;
                auVar2 = vdpps_avx(local_720._0_16_,auVar269,0x7f);
                fVar222 = auVar88._0_4_;
                fVar249 = auVar2._0_4_;
                auVar155._0_4_ = fVar249 * fVar249;
                auVar155._4_4_ = auVar2._4_4_ * auVar2._4_4_;
                auVar155._8_4_ = auVar2._8_4_ * auVar2._8_4_;
                auVar155._12_4_ = auVar2._12_4_ * auVar2._12_4_;
                auVar20 = vsubps_avx(local_740._0_16_,auVar155);
                fVar250 = auVar20._0_4_;
                auVar181._4_12_ = ZEXT812(0) << 0x20;
                auVar181._0_4_ = fVar250;
                auVar80 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar181);
                auVar76 = vmulss_avx512f(auVar80,ZEXT416(0x3fc00000));
                auVar77 = vmulss_avx512f(auVar20,ZEXT416(0xbf000000));
                if (fVar250 < 0.0) {
                  local_640 = fVar248;
                  fStack_63c = fVar248;
                  fStack_638 = fVar248;
                  fStack_634 = fVar248;
                  local_630 = auVar269;
                  local_620 = auVar80;
                  fVar250 = sqrtf(fVar250);
                  auVar77 = ZEXT416(auVar77._0_4_);
                  auVar76 = ZEXT416(auVar76._0_4_);
                  auVar85 = ZEXT416(auVar85._0_4_);
                  auVar88 = ZEXT416((uint)local_7e0._0_4_);
                  auVar89 = _local_7c0;
                  auVar269 = local_630;
                  auVar80 = local_620;
                  fVar248 = local_640;
                  fVar223 = fStack_63c;
                  fVar224 = fStack_638;
                  fVar230 = fStack_634;
                }
                else {
                  auVar20 = vsqrtss_avx(auVar20,auVar20);
                  fVar250 = auVar20._0_4_;
                  fVar223 = fVar248;
                  fVar224 = fVar248;
                  fVar230 = fVar248;
                }
                auVar265 = ZEXT1664(auVar89);
                auVar260 = ZEXT1664(local_740._0_16_);
                auVar252 = ZEXT1664(local_720._0_16_);
                auVar103 = vmovdqa64_avx512vl(auVar91);
                auVar270 = ZEXT3264(auVar103);
                auVar271 = ZEXT3264(local_840);
                auVar272 = ZEXT3264(local_860);
                auVar20 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_780._0_16_,auVar84);
                auVar84 = vfmadd231ss_fma(local_780._0_16_,auVar84,SUB6416(ZEXT464(0xc0000000),0));
                auVar204._0_4_ = fVar254 * (float)local_6e0._0_4_;
                auVar204._4_4_ = fVar254 * (float)local_6e0._4_4_;
                auVar204._8_4_ = fVar254 * fStack_6d8;
                auVar204._12_4_ = fVar254 * fStack_6d4;
                auVar220._0_4_ = auVar84._0_4_;
                auVar220._4_4_ = auVar220._0_4_;
                auVar220._8_4_ = auVar220._0_4_;
                auVar220._12_4_ = auVar220._0_4_;
                auVar84 = vfmadd132ps_fma(auVar220,auVar204,local_6a0._0_16_);
                auVar182._0_4_ = auVar20._0_4_;
                auVar182._4_4_ = auVar182._0_4_;
                auVar182._8_4_ = auVar182._0_4_;
                auVar182._12_4_ = auVar182._0_4_;
                auVar84 = vfmadd132ps_fma(auVar182,auVar84,local_6c0._0_16_);
                auVar84 = vfmadd132ps_fma(_local_580,auVar84,local_680._0_16_);
                auVar183._0_4_ = auVar84._0_4_ * (float)local_5a0._0_4_;
                auVar183._4_4_ = auVar84._4_4_ * (float)local_5a0._0_4_;
                auVar183._8_4_ = auVar84._8_4_ * (float)local_5a0._0_4_;
                auVar183._12_4_ = auVar84._12_4_ * (float)local_5a0._0_4_;
                auVar84 = vdpps_avx(auVar89,auVar84,0x7f);
                fVar190 = auVar84._0_4_;
                auVar205._0_4_ = auVar89._0_4_ * fVar190;
                auVar205._4_4_ = auVar89._4_4_ * fVar190;
                auVar205._8_4_ = auVar89._8_4_ * fVar190;
                auVar205._12_4_ = auVar89._12_4_ * fVar190;
                auVar84 = vsubps_avx(auVar183,auVar205);
                fVar190 = (float)local_5e0._0_4_ * (float)local_5c0._0_4_;
                auVar31._8_4_ = 0x80000000;
                auVar31._0_8_ = 0x8000000080000000;
                auVar31._12_4_ = 0x80000000;
                auVar79 = vxorps_avx512vl(auVar89,auVar31);
                auVar229._0_4_ = fVar248 * auVar84._0_4_ * fVar190;
                auVar229._4_4_ = fVar223 * auVar84._4_4_ * fVar190;
                auVar229._8_4_ = fVar224 * auVar84._8_4_ * fVar190;
                auVar229._12_4_ = fVar230 * auVar84._12_4_ * fVar190;
                auVar84 = vdpps_avx(auVar79,auVar269,0x7f);
                auVar20 = vmaxss_avx(ZEXT416((uint)local_600._0_4_),
                                     ZEXT416((uint)((float)local_7a0._0_4_ * fVar245 * 1.9073486e-06
                                                   )));
                auVar78 = vdivss_avx512f(ZEXT416((uint)local_600._0_4_),auVar85);
                auVar85 = vdpps_avx(local_720._0_16_,auVar229,0x7f);
                auVar88 = vfmadd213ss_fma(auVar88,ZEXT416((uint)local_600._0_4_),auVar20);
                auVar78 = vfmadd213ss_fma(ZEXT416((uint)(fVar222 + 1.0)),auVar78,auVar88);
                auVar88 = vdpps_avx(local_6f0,auVar269,0x7f);
                fVar248 = auVar84._0_4_ + auVar85._0_4_;
                auVar84 = vdpps_avx(local_720._0_16_,auVar79,0x7f);
                auVar77 = vmulss_avx512f(auVar77,auVar80);
                auVar80 = vmulss_avx512f(auVar80,auVar80);
                auVar85 = vdpps_avx(local_720._0_16_,local_6f0,0x7f);
                auVar77 = vaddss_avx512f(auVar76,ZEXT416((uint)(auVar77._0_4_ * auVar80._0_4_)));
                auVar80 = vfnmadd231ss_fma(auVar84,auVar2,ZEXT416((uint)fVar248));
                auVar76 = vfnmadd231ss_fma(auVar85,auVar2,auVar88);
                auVar84 = vpermilps_avx(local_560._0_16_,0xff);
                fVar250 = fVar250 - auVar84._0_4_;
                auVar84 = vshufps_avx(auVar89,auVar89,0xff);
                auVar85 = vfmsub213ss_fma(auVar80,auVar77,auVar84);
                fVar222 = auVar76._0_4_ * auVar77._0_4_;
                auVar80 = vfmsub231ss_fma(ZEXT416((uint)(auVar88._0_4_ * auVar85._0_4_)),
                                          ZEXT416((uint)fVar248),ZEXT416((uint)fVar222));
                auVar244 = ZEXT1664(auVar80);
                fVar223 = auVar80._0_4_;
                fVar254 = fVar254 - (fVar249 * (fVar222 / fVar223) -
                                    fVar250 * (auVar88._0_4_ / fVar223));
                auVar237 = ZEXT464((uint)fVar254);
                fVar248 = (float)local_7a0._0_4_ -
                          (fVar250 * (fVar248 / fVar223) - fVar249 * (auVar85._0_4_ / fVar223));
                auVar247 = ZEXT464((uint)fVar248);
                auVar32._8_4_ = 0x7fffffff;
                auVar32._0_8_ = 0x7fffffff7fffffff;
                auVar32._12_4_ = 0x7fffffff;
                auVar88 = vandps_avx512vl(auVar2,auVar32);
              } while (auVar78._0_4_ <= auVar88._0_4_);
              auVar88 = vfmadd231ss_fma(ZEXT416((uint)(auVar78._0_4_ + auVar20._0_4_)),local_650,
                                        ZEXT416(0x36000000));
              auVar33._8_4_ = 0x7fffffff;
              auVar33._0_8_ = 0x7fffffff7fffffff;
              auVar33._12_4_ = 0x7fffffff;
              auVar85 = vandps_avx512vl(ZEXT416((uint)fVar250),auVar33);
            } while (auVar88._0_4_ <= auVar85._0_4_);
            fVar245 = fVar248 + (float)local_660._0_4_;
            if ((((fVar18 <= fVar245) &&
                 (fVar249 = *(float *)(ray + k * 4 + 0x80), fVar245 <= fVar249)) && (0.0 <= fVar254)
                ) && (fVar254 <= 1.0)) {
              auVar206._4_12_ = SUB1612(ZEXT816(0),0);
              auVar206._0_4_ = local_740._0_4_;
              auVar88 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar206);
              fVar250 = auVar88._0_4_;
              pGVar5 = (context->scene->geometries).items[uVar3].ptr;
              if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                fVar250 = fVar250 * 1.5 + local_740._0_4_ * -0.5 * fVar250 * fVar250 * fVar250;
                auVar207._0_4_ = local_720._0_4_ * fVar250;
                auVar207._4_4_ = local_720._4_4_ * fVar250;
                auVar207._8_4_ = local_720._8_4_ * fVar250;
                auVar207._12_4_ = local_720._12_4_ * fVar250;
                auVar2 = vfmadd213ps_fma(auVar84,auVar207,auVar89);
                auVar84 = vshufps_avx(auVar207,auVar207,0xc9);
                auVar88 = vshufps_avx(auVar89,auVar89,0xc9);
                auVar208._0_4_ = auVar207._0_4_ * auVar88._0_4_;
                auVar208._4_4_ = auVar207._4_4_ * auVar88._4_4_;
                auVar208._8_4_ = auVar207._8_4_ * auVar88._8_4_;
                auVar208._12_4_ = auVar207._12_4_ * auVar88._12_4_;
                auVar85 = vfmsub231ps_fma(auVar208,auVar89,auVar84);
                auVar84 = vshufps_avx(auVar85,auVar85,0xc9);
                auVar88 = vshufps_avx(auVar2,auVar2,0xc9);
                auVar85 = vshufps_avx(auVar85,auVar85,0xd2);
                auVar156._0_4_ = auVar2._0_4_ * auVar85._0_4_;
                auVar156._4_4_ = auVar2._4_4_ * auVar85._4_4_;
                auVar156._8_4_ = auVar2._8_4_ * auVar85._8_4_;
                auVar156._12_4_ = auVar2._12_4_ * auVar85._12_4_;
                auVar84 = vfmsub231ps_fma(auVar156,auVar84,auVar88);
                uVar171 = auVar84._0_4_;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  *(float *)(ray + k * 4 + 0x80) = fVar245;
                  uVar4 = vextractps_avx(auVar84,1);
                  *(undefined4 *)(ray + k * 4 + 0xc0) = uVar4;
                  uVar4 = vextractps_avx(auVar84,2);
                  *(undefined4 *)(ray + k * 4 + 0xd0) = uVar4;
                  *(undefined4 *)(ray + k * 4 + 0xe0) = uVar171;
                  *(float *)(ray + k * 4 + 0xf0) = fVar254;
                  *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                  *(int *)(ray + k * 4 + 0x110) = (int)local_748;
                  *(uint *)(ray + k * 4 + 0x120) = uVar3;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                }
                else {
                  local_500 = (RTCHitN  [16])vshufps_avx(auVar84,auVar84,0x55);
                  auStack_4f0 = vshufps_avx(auVar84,auVar84,0xaa);
                  local_4e0 = uVar171;
                  uStack_4dc = uVar171;
                  uStack_4d8 = uVar171;
                  uStack_4d4 = uVar171;
                  local_4d0 = fVar254;
                  fStack_4cc = fVar254;
                  fStack_4c8 = fVar254;
                  fStack_4c4 = fVar254;
                  local_4c0 = ZEXT416(0) << 0x20;
                  local_4b0 = local_520._0_8_;
                  uStack_4a8 = local_520._8_8_;
                  local_4a0 = local_510;
                  vpcmpeqd_avx2(ZEXT1632(local_510),ZEXT1632(local_510));
                  uStack_48c = context->user->instID[0];
                  local_490 = uStack_48c;
                  uStack_488 = uStack_48c;
                  uStack_484 = uStack_48c;
                  uStack_480 = context->user->instPrimID[0];
                  uStack_47c = uStack_480;
                  uStack_478 = uStack_480;
                  uStack_474 = uStack_480;
                  *(float *)(ray + k * 4 + 0x80) = fVar245;
                  local_890 = local_530;
                  local_810.valid = (int *)local_890;
                  local_810.geometryUserPtr = pGVar5->userPtr;
                  local_810.context = context->user;
                  local_810.hit = local_500;
                  local_810.N = 4;
                  local_810.ray = (RTCRayN *)ray;
                  if (pGVar5->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar244 = ZEXT1664(auVar80);
                    auVar247 = ZEXT464((uint)fVar248);
                    auVar252 = ZEXT1664(local_720._0_16_);
                    auVar260 = ZEXT1664(local_740._0_16_);
                    auVar265 = ZEXT1664(auVar89);
                    (*pGVar5->intersectionFilterN)(&local_810);
                    auVar272 = ZEXT3264(local_860);
                    auVar271 = ZEXT3264(local_840);
                    auVar103 = vmovdqa64_avx512vl(auVar91);
                    auVar270 = ZEXT3264(auVar103);
                  }
                  uVar68 = vptestmd_avx512vl(local_890,local_890);
                  if ((uVar68 & 0xf) != 0) {
                    p_Var9 = context->args->filter;
                    if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar244 = ZEXT1664(auVar244._0_16_);
                      auVar247 = ZEXT1664(auVar247._0_16_);
                      auVar252 = ZEXT1664(auVar252._0_16_);
                      auVar260 = ZEXT1664(auVar260._0_16_);
                      auVar265 = ZEXT1664(auVar265._0_16_);
                      (*p_Var9)(&local_810);
                      auVar272 = ZEXT3264(local_860);
                      auVar271 = ZEXT3264(local_840);
                      auVar103 = vmovdqa64_avx512vl(auVar91);
                      auVar270 = ZEXT3264(auVar103);
                    }
                    uVar68 = vptestmd_avx512vl(local_890,local_890);
                    uVar68 = uVar68 & 0xf;
                    bVar63 = (byte)uVar68;
                    if (bVar63 != 0) {
                      iVar54 = *(int *)(local_810.hit + 4);
                      iVar55 = *(int *)(local_810.hit + 8);
                      iVar56 = *(int *)(local_810.hit + 0xc);
                      bVar67 = (bool)((byte)(uVar68 >> 1) & 1);
                      bVar10 = (bool)((byte)(uVar68 >> 2) & 1);
                      bVar11 = SUB81(uVar68 >> 3,0);
                      *(uint *)(local_810.ray + 0xc0) =
                           (uint)(bVar63 & 1) * *(int *)local_810.hit |
                           (uint)!(bool)(bVar63 & 1) * *(int *)(local_810.ray + 0xc0);
                      *(uint *)(local_810.ray + 0xc4) =
                           (uint)bVar67 * iVar54 | (uint)!bVar67 * *(int *)(local_810.ray + 0xc4);
                      *(uint *)(local_810.ray + 200) =
                           (uint)bVar10 * iVar55 | (uint)!bVar10 * *(int *)(local_810.ray + 200);
                      *(uint *)(local_810.ray + 0xcc) =
                           (uint)bVar11 * iVar56 | (uint)!bVar11 * *(int *)(local_810.ray + 0xcc);
                      iVar54 = *(int *)(local_810.hit + 0x14);
                      iVar55 = *(int *)(local_810.hit + 0x18);
                      iVar56 = *(int *)(local_810.hit + 0x1c);
                      bVar67 = (bool)((byte)(uVar68 >> 1) & 1);
                      bVar10 = (bool)((byte)(uVar68 >> 2) & 1);
                      bVar11 = SUB81(uVar68 >> 3,0);
                      *(uint *)(local_810.ray + 0xd0) =
                           (uint)(bVar63 & 1) * *(int *)(local_810.hit + 0x10) |
                           (uint)!(bool)(bVar63 & 1) * *(int *)(local_810.ray + 0xd0);
                      *(uint *)(local_810.ray + 0xd4) =
                           (uint)bVar67 * iVar54 | (uint)!bVar67 * *(int *)(local_810.ray + 0xd4);
                      *(uint *)(local_810.ray + 0xd8) =
                           (uint)bVar10 * iVar55 | (uint)!bVar10 * *(int *)(local_810.ray + 0xd8);
                      *(uint *)(local_810.ray + 0xdc) =
                           (uint)bVar11 * iVar56 | (uint)!bVar11 * *(int *)(local_810.ray + 0xdc);
                      iVar54 = *(int *)(local_810.hit + 0x24);
                      iVar55 = *(int *)(local_810.hit + 0x28);
                      iVar56 = *(int *)(local_810.hit + 0x2c);
                      bVar67 = (bool)((byte)(uVar68 >> 1) & 1);
                      bVar10 = (bool)((byte)(uVar68 >> 2) & 1);
                      bVar11 = SUB81(uVar68 >> 3,0);
                      *(uint *)(local_810.ray + 0xe0) =
                           (uint)(bVar63 & 1) * *(int *)(local_810.hit + 0x20) |
                           (uint)!(bool)(bVar63 & 1) * *(int *)(local_810.ray + 0xe0);
                      *(uint *)(local_810.ray + 0xe4) =
                           (uint)bVar67 * iVar54 | (uint)!bVar67 * *(int *)(local_810.ray + 0xe4);
                      *(uint *)(local_810.ray + 0xe8) =
                           (uint)bVar10 * iVar55 | (uint)!bVar10 * *(int *)(local_810.ray + 0xe8);
                      *(uint *)(local_810.ray + 0xec) =
                           (uint)bVar11 * iVar56 | (uint)!bVar11 * *(int *)(local_810.ray + 0xec);
                      iVar54 = *(int *)(local_810.hit + 0x34);
                      iVar55 = *(int *)(local_810.hit + 0x38);
                      iVar56 = *(int *)(local_810.hit + 0x3c);
                      bVar67 = (bool)((byte)(uVar68 >> 1) & 1);
                      bVar10 = (bool)((byte)(uVar68 >> 2) & 1);
                      bVar11 = SUB81(uVar68 >> 3,0);
                      *(uint *)(local_810.ray + 0xf0) =
                           (uint)(bVar63 & 1) * *(int *)(local_810.hit + 0x30) |
                           (uint)!(bool)(bVar63 & 1) * *(int *)(local_810.ray + 0xf0);
                      *(uint *)(local_810.ray + 0xf4) =
                           (uint)bVar67 * iVar54 | (uint)!bVar67 * *(int *)(local_810.ray + 0xf4);
                      *(uint *)(local_810.ray + 0xf8) =
                           (uint)bVar10 * iVar55 | (uint)!bVar10 * *(int *)(local_810.ray + 0xf8);
                      *(uint *)(local_810.ray + 0xfc) =
                           (uint)bVar11 * iVar56 | (uint)!bVar11 * *(int *)(local_810.ray + 0xfc);
                      iVar54 = *(int *)(local_810.hit + 0x44);
                      iVar55 = *(int *)(local_810.hit + 0x48);
                      iVar56 = *(int *)(local_810.hit + 0x4c);
                      bVar67 = (bool)((byte)(uVar68 >> 1) & 1);
                      bVar10 = (bool)((byte)(uVar68 >> 2) & 1);
                      bVar11 = SUB81(uVar68 >> 3,0);
                      *(uint *)(local_810.ray + 0x100) =
                           (uint)(bVar63 & 1) * *(int *)(local_810.hit + 0x40) |
                           (uint)!(bool)(bVar63 & 1) * *(int *)(local_810.ray + 0x100);
                      *(uint *)(local_810.ray + 0x104) =
                           (uint)bVar67 * iVar54 | (uint)!bVar67 * *(int *)(local_810.ray + 0x104);
                      *(uint *)(local_810.ray + 0x108) =
                           (uint)bVar10 * iVar55 | (uint)!bVar10 * *(int *)(local_810.ray + 0x108);
                      *(uint *)(local_810.ray + 0x10c) =
                           (uint)bVar11 * iVar56 | (uint)!bVar11 * *(int *)(local_810.ray + 0x10c);
                      auVar84 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_810.hit + 0x50));
                      *(undefined1 (*) [16])(local_810.ray + 0x110) = auVar84;
                      auVar84 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_810.hit + 0x60));
                      *(undefined1 (*) [16])(local_810.ray + 0x120) = auVar84;
                      auVar84 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_810.hit + 0x70));
                      *(undefined1 (*) [16])(local_810.ray + 0x130) = auVar84;
                      auVar84 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_810.hit + 0x80));
                      *(undefined1 (*) [16])(local_810.ray + 0x140) = auVar84;
                      goto LAB_018d165a;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x80) = fVar249;
                }
              }
            }
LAB_018d165a:
            uVar171 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar236._4_4_ = uVar171;
            auVar236._0_4_ = uVar171;
            auVar236._8_4_ = uVar171;
            auVar236._12_4_ = uVar171;
            auVar236._16_4_ = uVar171;
            auVar236._20_4_ = uVar171;
            auVar236._24_4_ = uVar171;
            auVar236._28_4_ = uVar171;
            auVar237 = ZEXT3264(auVar236);
            auVar58._4_4_ = fStack_3bc;
            auVar58._0_4_ = local_3c0;
            auVar58._8_4_ = fStack_3b8;
            auVar58._12_4_ = fStack_3b4;
            auVar58._16_4_ = fStack_3b0;
            auVar58._20_4_ = fStack_3ac;
            auVar58._24_4_ = fStack_3a8;
            auVar58._28_4_ = fStack_3a4;
            uVar23 = vcmpps_avx512vl(auVar236,auVar58,0xd);
          }
          uVar26 = vpcmpd_avx512vl(local_380,local_300,1);
          uVar25 = vpcmpd_avx512vl(local_380,_local_3e0,1);
          auVar186._0_4_ = (float)local_400._0_4_ + (float)local_200._0_4_;
          auVar186._4_4_ = (float)local_400._4_4_ + (float)local_200._4_4_;
          auVar186._8_4_ = fStack_3f8 + fStack_1f8;
          auVar186._12_4_ = fStack_3f4 + fStack_1f4;
          auVar186._16_4_ = fStack_3f0 + fStack_1f0;
          auVar186._20_4_ = fStack_3ec + fStack_1ec;
          auVar186._24_4_ = fStack_3e8 + fStack_1e8;
          auVar186._28_4_ = fStack_3e4 + fStack_1e4;
          uVar171 = auVar237._0_4_;
          auVar209._4_4_ = uVar171;
          auVar209._0_4_ = uVar171;
          auVar209._8_4_ = uVar171;
          auVar209._12_4_ = uVar171;
          auVar209._16_4_ = uVar171;
          auVar209._20_4_ = uVar171;
          auVar209._24_4_ = uVar171;
          auVar209._28_4_ = uVar171;
          uVar23 = vcmpps_avx512vl(auVar186,auVar209,2);
          bVar64 = (byte)local_86c & (byte)uVar26 & (byte)uVar23;
          auVar221._0_4_ = (float)local_400._0_4_ + (float)local_340._0_4_;
          auVar221._4_4_ = (float)local_400._4_4_ + (float)local_340._4_4_;
          auVar221._8_4_ = fStack_3f8 + fStack_338;
          auVar221._12_4_ = fStack_3f4 + fStack_334;
          auVar221._16_4_ = fStack_3f0 + fStack_330;
          auVar221._20_4_ = fStack_3ec + fStack_32c;
          auVar221._24_4_ = fStack_3e8 + fStack_328;
          auVar221._28_4_ = fStack_3e4 + fStack_324;
          uVar23 = vcmpps_avx512vl(auVar221,auVar209,2);
          bVar60 = bVar60 & (byte)uVar25 & (byte)uVar23 | bVar64;
          if (bVar60 != 0) {
            abStack_180[uVar62 * 0x60] = bVar60;
            bVar67 = (bool)(bVar64 >> 1 & 1);
            bVar10 = (bool)(bVar64 >> 2 & 1);
            bVar11 = (bool)(bVar64 >> 3 & 1);
            bVar12 = (bool)(bVar64 >> 4 & 1);
            bVar13 = (bool)(bVar64 >> 5 & 1);
            bVar14 = (bool)(bVar64 >> 6 & 1);
            auStack_160[uVar62 * 0x18] =
                 (uint)(bVar64 & 1) * local_200._0_4_ | (uint)!(bool)(bVar64 & 1) * local_340._0_4_;
            auStack_160[uVar62 * 0x18 + 1] =
                 (uint)bVar67 * local_200._4_4_ | (uint)!bVar67 * local_340._4_4_;
            auStack_160[uVar62 * 0x18 + 2] =
                 (uint)bVar10 * (int)fStack_1f8 | (uint)!bVar10 * (int)fStack_338;
            auStack_160[uVar62 * 0x18 + 3] =
                 (uint)bVar11 * (int)fStack_1f4 | (uint)!bVar11 * (int)fStack_334;
            auStack_160[uVar62 * 0x18 + 4] =
                 (uint)bVar12 * (int)fStack_1f0 | (uint)!bVar12 * (int)fStack_330;
            auStack_160[uVar62 * 0x18 + 5] =
                 (uint)bVar13 * (int)fStack_1ec | (uint)!bVar13 * (int)fStack_32c;
            auStack_160[uVar62 * 0x18 + 6] =
                 (uint)bVar14 * (int)fStack_1e8 | (uint)!bVar14 * (int)fStack_328;
            auStack_160[uVar62 * 0x18 + 7] =
                 (uint)(bVar64 >> 7) * (int)fStack_1e4 |
                 (uint)!(bool)(bVar64 >> 7) * (int)fStack_324;
            uVar68 = vmovlps_avx(local_390);
            (&uStack_140)[uVar62 * 0xc] = uVar68;
            aiStack_138[uVar62 * 0x18] = local_874 + 1;
            uVar62 = (ulong)((int)uVar62 + 1);
          }
        }
        auVar237 = ZEXT3264(_DAT_01f7b040);
      }
    }
    do {
      uVar69 = (uint)uVar62;
      uVar62 = (ulong)(uVar69 - 1);
      if (uVar69 == 0) {
        uVar171 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar34._4_4_ = uVar171;
        auVar34._0_4_ = uVar171;
        auVar34._8_4_ = uVar171;
        auVar34._12_4_ = uVar171;
        uVar23 = vcmpps_avx512vl(local_3a0,auVar34,2);
        local_608 = (ulong)((uint)uVar23 & (uint)local_608 - 1 & (uint)local_608);
        goto LAB_018cf03a;
      }
      auVar103 = *(undefined1 (*) [32])(auStack_160 + uVar62 * 0x18);
      auVar187._0_4_ = auVar103._0_4_ + (float)local_400._0_4_;
      auVar187._4_4_ = auVar103._4_4_ + (float)local_400._4_4_;
      auVar187._8_4_ = auVar103._8_4_ + fStack_3f8;
      auVar187._12_4_ = auVar103._12_4_ + fStack_3f4;
      auVar187._16_4_ = auVar103._16_4_ + fStack_3f0;
      auVar187._20_4_ = auVar103._20_4_ + fStack_3ec;
      auVar187._24_4_ = auVar103._24_4_ + fStack_3e8;
      auVar187._28_4_ = auVar103._28_4_ + fStack_3e4;
      uVar171 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar38._4_4_ = uVar171;
      auVar38._0_4_ = uVar171;
      auVar38._8_4_ = uVar171;
      auVar38._12_4_ = uVar171;
      auVar38._16_4_ = uVar171;
      auVar38._20_4_ = uVar171;
      auVar38._24_4_ = uVar171;
      auVar38._28_4_ = uVar171;
      uVar23 = vcmpps_avx512vl(auVar187,auVar38,2);
      uVar141 = (uint)uVar23 & (uint)abStack_180[uVar62 * 0x60];
    } while (uVar141 == 0);
    uVar68 = (&uStack_140)[uVar62 * 0xc];
    auVar184._8_8_ = 0;
    auVar184._0_8_ = uVar68;
    auVar210._8_4_ = 0x7f800000;
    auVar210._0_8_ = 0x7f8000007f800000;
    auVar210._12_4_ = 0x7f800000;
    auVar210._16_4_ = 0x7f800000;
    auVar210._20_4_ = 0x7f800000;
    auVar210._24_4_ = 0x7f800000;
    auVar210._28_4_ = 0x7f800000;
    auVar100 = vblendmps_avx512vl(auVar210,auVar103);
    bVar60 = (byte)uVar141;
    auVar140._0_4_ =
         (uint)(bVar60 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar60 & 1) * (int)auVar103._0_4_;
    bVar67 = (bool)((byte)(uVar141 >> 1) & 1);
    auVar140._4_4_ = (uint)bVar67 * auVar100._4_4_ | (uint)!bVar67 * (int)auVar103._4_4_;
    bVar67 = (bool)((byte)(uVar141 >> 2) & 1);
    auVar140._8_4_ = (uint)bVar67 * auVar100._8_4_ | (uint)!bVar67 * (int)auVar103._8_4_;
    bVar67 = (bool)((byte)(uVar141 >> 3) & 1);
    auVar140._12_4_ = (uint)bVar67 * auVar100._12_4_ | (uint)!bVar67 * (int)auVar103._12_4_;
    bVar67 = (bool)((byte)(uVar141 >> 4) & 1);
    auVar140._16_4_ = (uint)bVar67 * auVar100._16_4_ | (uint)!bVar67 * (int)auVar103._16_4_;
    bVar67 = (bool)((byte)(uVar141 >> 5) & 1);
    auVar140._20_4_ = (uint)bVar67 * auVar100._20_4_ | (uint)!bVar67 * (int)auVar103._20_4_;
    bVar67 = (bool)((byte)(uVar141 >> 6) & 1);
    auVar140._24_4_ = (uint)bVar67 * auVar100._24_4_ | (uint)!bVar67 * (int)auVar103._24_4_;
    auVar140._28_4_ =
         (uVar141 >> 7) * auVar100._28_4_ | (uint)!SUB41(uVar141 >> 7,0) * (int)auVar103._28_4_;
    auVar103 = vshufps_avx(auVar140,auVar140,0xb1);
    auVar103 = vminps_avx(auVar140,auVar103);
    auVar100 = vshufpd_avx(auVar103,auVar103,5);
    auVar103 = vminps_avx(auVar103,auVar100);
    auVar100 = vpermpd_avx2(auVar103,0x4e);
    auVar103 = vminps_avx(auVar103,auVar100);
    uVar23 = vcmpps_avx512vl(auVar140,auVar103,0);
    bVar64 = (byte)uVar23 & bVar60;
    if (bVar64 != 0) {
      uVar141 = (uint)bVar64;
    }
    uVar142 = 0;
    for (; (uVar141 & 1) == 0; uVar141 = uVar141 >> 1 | 0x80000000) {
      uVar142 = uVar142 + 1;
    }
    local_874 = aiStack_138[uVar62 * 0x18];
    bVar60 = ~('\x01' << ((byte)uVar142 & 0x1f)) & bVar60;
    abStack_180[uVar62 * 0x60] = bVar60;
    if (bVar60 == 0) {
      uVar69 = uVar69 - 1;
    }
    uVar171 = (undefined4)uVar68;
    auVar164._4_4_ = uVar171;
    auVar164._0_4_ = uVar171;
    auVar164._8_4_ = uVar171;
    auVar164._12_4_ = uVar171;
    auVar164._16_4_ = uVar171;
    auVar164._20_4_ = uVar171;
    auVar164._24_4_ = uVar171;
    auVar164._28_4_ = uVar171;
    auVar84 = vmovshdup_avx(auVar184);
    auVar84 = vsubps_avx(auVar84,auVar184);
    auVar188._0_4_ = auVar84._0_4_;
    auVar188._4_4_ = auVar188._0_4_;
    auVar188._8_4_ = auVar188._0_4_;
    auVar188._12_4_ = auVar188._0_4_;
    auVar188._16_4_ = auVar188._0_4_;
    auVar188._20_4_ = auVar188._0_4_;
    auVar188._24_4_ = auVar188._0_4_;
    auVar188._28_4_ = auVar188._0_4_;
    auVar84 = vfmadd132ps_fma(auVar188,auVar164,auVar237._0_32_);
    _local_500 = ZEXT1632(auVar84);
    local_390._8_8_ = 0;
    local_390._0_8_ = *(ulong *)(local_500 + (ulong)uVar142 * 4);
    uVar62 = (ulong)uVar69;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }